

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  void *pvVar13;
  __int_type_conflict _Var14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  byte bVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  ulong uVar69;
  long lVar70;
  uint uVar71;
  ulong uVar73;
  undefined4 uVar74;
  undefined8 in_R11;
  bool bVar75;
  ulong uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar78 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar108 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float t1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar193;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar210;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar206 [32];
  float fVar211;
  float fVar215;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar216;
  float fVar228;
  float fVar229;
  undefined1 auVar217 [16];
  float fVar230;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar231;
  float fVar233;
  float fVar234;
  undefined1 auVar226 [32];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar248;
  float fVar249;
  vfloat4 b0;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar250;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar278;
  undefined1 auVar277 [32];
  __m128 a;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar300;
  float fVar301;
  vfloat4 a0_1;
  float fVar302;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar303;
  float fVar308;
  undefined1 auVar304 [16];
  float fVar306;
  float fVar307;
  float fVar309;
  float fVar310;
  float fVar311;
  float in_register_0000151c;
  undefined1 auVar305 [32];
  float fVar312;
  float fVar313;
  float fVar319;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar317;
  float fVar318;
  undefined1 auVar316 [32];
  float fVar320;
  float fVar321;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  float in_register_0000159c;
  undefined1 auVar329 [64];
  float fVar338;
  vfloat4 a0;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  float in_register_000015dc;
  undefined1 auVar336 [32];
  undefined1 auVar337 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  uint auStack_4d0 [4];
  RTCFilterFunctionNArguments local_4c0;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  float afStack_360 [8];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar72;
  undefined1 auVar227 [32];
  undefined1 auVar328 [32];
  
  PVar10 = prim[1];
  uVar69 = (ulong)(byte)PVar10;
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar221 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar221 = vinsertps_avx(auVar221,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar235 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar82 = vsubps_avx(auVar82,*(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  auVar104._0_4_ = fVar235 * auVar82._0_4_;
  auVar104._4_4_ = fVar235 * auVar82._4_4_;
  auVar104._8_4_ = fVar235 * auVar82._8_4_;
  auVar104._12_4_ = fVar235 * auVar82._12_4_;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar156 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 10)));
  auVar217._0_4_ = fVar235 * auVar221._0_4_;
  auVar217._4_4_ = fVar235 * auVar221._4_4_;
  auVar217._8_4_ = fVar235 * auVar221._8_4_;
  auVar217._12_4_ = fVar235 * auVar221._12_4_;
  auVar93._16_16_ = auVar156;
  auVar93._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 6)));
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 10)));
  auVar158._16_16_ = auVar221;
  auVar158._0_16_ = auVar82;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar158);
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 10)));
  auVar171._16_16_ = auVar221;
  auVar171._0_16_ = auVar82;
  auVar18 = vcvtdq2ps_avx(auVar171);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xb + 6)));
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xb + 10)));
  auVar172._16_16_ = auVar221;
  auVar172._0_16_ = auVar82;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xc + 6)));
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xc + 10)));
  auVar19 = vcvtdq2ps_avx(auVar172);
  auVar206._16_16_ = auVar221;
  auVar206._0_16_ = auVar82;
  auVar20 = vcvtdq2ps_avx(auVar206);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xd + 6)));
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xd + 10)));
  auVar243._16_16_ = auVar221;
  auVar243._0_16_ = auVar82;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x12 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar243);
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x12 + 10)));
  auVar244._16_16_ = auVar221;
  auVar244._0_16_ = auVar82;
  auVar22 = vcvtdq2ps_avx(auVar244);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x13 + 6)));
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x13 + 10)));
  auVar274._16_16_ = auVar221;
  auVar274._0_16_ = auVar82;
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x14 + 6)));
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x14 + 10)));
  auVar23 = vcvtdq2ps_avx(auVar274);
  auVar288._16_16_ = auVar221;
  auVar288._0_16_ = auVar82;
  auVar24 = vcvtdq2ps_avx(auVar288);
  auVar82 = vshufps_avx(auVar217,auVar217,0);
  auVar221 = vshufps_avx(auVar217,auVar217,0x55);
  auVar156 = vshufps_avx(auVar217,auVar217,0xaa);
  fVar235 = auVar156._0_4_;
  fVar193 = auVar156._4_4_;
  fVar248 = auVar156._8_4_;
  fVar210 = auVar156._12_4_;
  fVar249 = auVar221._0_4_;
  fVar215 = auVar221._4_4_;
  fVar250 = auVar221._8_4_;
  fVar211 = auVar221._12_4_;
  fVar251 = auVar82._0_4_;
  fVar212 = auVar82._4_4_;
  fVar252 = auVar82._8_4_;
  fVar213 = auVar82._12_4_;
  auVar305._0_4_ = fVar251 * auVar93._0_4_ + fVar249 * auVar17._0_4_ + fVar235 * auVar18._0_4_;
  auVar305._4_4_ = fVar212 * auVar93._4_4_ + fVar215 * auVar17._4_4_ + fVar193 * auVar18._4_4_;
  auVar305._8_4_ = fVar252 * auVar93._8_4_ + fVar250 * auVar17._8_4_ + fVar248 * auVar18._8_4_;
  auVar305._12_4_ = fVar213 * auVar93._12_4_ + fVar211 * auVar17._12_4_ + fVar210 * auVar18._12_4_;
  auVar305._16_4_ = fVar251 * auVar93._16_4_ + fVar249 * auVar17._16_4_ + fVar235 * auVar18._16_4_;
  auVar305._20_4_ = fVar212 * auVar93._20_4_ + fVar215 * auVar17._20_4_ + fVar193 * auVar18._20_4_;
  auVar305._24_4_ = fVar252 * auVar93._24_4_ + fVar250 * auVar17._24_4_ + fVar248 * auVar18._24_4_;
  auVar305._28_4_ = fVar211 + in_register_000015dc + in_register_0000151c;
  auVar297._0_4_ = fVar251 * auVar19._0_4_ + fVar249 * auVar20._0_4_ + auVar21._0_4_ * fVar235;
  auVar297._4_4_ = fVar212 * auVar19._4_4_ + fVar215 * auVar20._4_4_ + auVar21._4_4_ * fVar193;
  auVar297._8_4_ = fVar252 * auVar19._8_4_ + fVar250 * auVar20._8_4_ + auVar21._8_4_ * fVar248;
  auVar297._12_4_ = fVar213 * auVar19._12_4_ + fVar211 * auVar20._12_4_ + auVar21._12_4_ * fVar210;
  auVar297._16_4_ = fVar251 * auVar19._16_4_ + fVar249 * auVar20._16_4_ + auVar21._16_4_ * fVar235;
  auVar297._20_4_ = fVar212 * auVar19._20_4_ + fVar215 * auVar20._20_4_ + auVar21._20_4_ * fVar193;
  auVar297._24_4_ = fVar252 * auVar19._24_4_ + fVar250 * auVar20._24_4_ + auVar21._24_4_ * fVar248;
  auVar297._28_4_ = fVar211 + in_register_000015dc + in_register_0000159c;
  auVar226._0_4_ = fVar251 * auVar22._0_4_ + fVar249 * auVar23._0_4_ + auVar24._0_4_ * fVar235;
  auVar226._4_4_ = fVar212 * auVar22._4_4_ + fVar215 * auVar23._4_4_ + auVar24._4_4_ * fVar193;
  auVar226._8_4_ = fVar252 * auVar22._8_4_ + fVar250 * auVar23._8_4_ + auVar24._8_4_ * fVar248;
  auVar226._12_4_ = fVar213 * auVar22._12_4_ + fVar211 * auVar23._12_4_ + auVar24._12_4_ * fVar210;
  auVar226._16_4_ = fVar251 * auVar22._16_4_ + fVar249 * auVar23._16_4_ + auVar24._16_4_ * fVar235;
  auVar226._20_4_ = fVar212 * auVar22._20_4_ + fVar215 * auVar23._20_4_ + auVar24._20_4_ * fVar193;
  auVar226._24_4_ = fVar252 * auVar22._24_4_ + fVar250 * auVar23._24_4_ + auVar24._24_4_ * fVar248;
  auVar226._28_4_ = fVar213 + fVar211 + fVar210;
  auVar82 = vshufps_avx(auVar104,auVar104,0);
  auVar221 = vshufps_avx(auVar104,auVar104,0x55);
  auVar156 = vshufps_avx(auVar104,auVar104,0xaa);
  fVar193 = auVar156._0_4_;
  fVar248 = auVar156._4_4_;
  fVar210 = auVar156._8_4_;
  fVar249 = auVar156._12_4_;
  fVar252 = auVar221._0_4_;
  fVar213 = auVar221._4_4_;
  fVar253 = auVar221._8_4_;
  fVar214 = auVar221._12_4_;
  fVar215 = auVar20._28_4_ + fVar249;
  fVar250 = auVar82._0_4_;
  fVar211 = auVar82._4_4_;
  fVar251 = auVar82._8_4_;
  fVar212 = auVar82._12_4_;
  fVar235 = auVar93._28_4_;
  auVar127._0_4_ = fVar250 * auVar93._0_4_ + fVar252 * auVar17._0_4_ + fVar193 * auVar18._0_4_;
  auVar127._4_4_ = fVar211 * auVar93._4_4_ + fVar213 * auVar17._4_4_ + fVar248 * auVar18._4_4_;
  auVar127._8_4_ = fVar251 * auVar93._8_4_ + fVar253 * auVar17._8_4_ + fVar210 * auVar18._8_4_;
  auVar127._12_4_ = fVar212 * auVar93._12_4_ + fVar214 * auVar17._12_4_ + fVar249 * auVar18._12_4_;
  auVar127._16_4_ = fVar250 * auVar93._16_4_ + fVar252 * auVar17._16_4_ + fVar193 * auVar18._16_4_;
  auVar127._20_4_ = fVar211 * auVar93._20_4_ + fVar213 * auVar17._20_4_ + fVar248 * auVar18._20_4_;
  auVar127._24_4_ = fVar251 * auVar93._24_4_ + fVar253 * auVar17._24_4_ + fVar210 * auVar18._24_4_;
  auVar127._28_4_ = fVar235 + auVar17._28_4_ + auVar18._28_4_;
  auVar159._0_4_ = fVar250 * auVar19._0_4_ + auVar21._0_4_ * fVar193 + fVar252 * auVar20._0_4_;
  auVar159._4_4_ = fVar211 * auVar19._4_4_ + auVar21._4_4_ * fVar248 + fVar213 * auVar20._4_4_;
  auVar159._8_4_ = fVar251 * auVar19._8_4_ + auVar21._8_4_ * fVar210 + fVar253 * auVar20._8_4_;
  auVar159._12_4_ = fVar212 * auVar19._12_4_ + auVar21._12_4_ * fVar249 + fVar214 * auVar20._12_4_;
  auVar159._16_4_ = fVar250 * auVar19._16_4_ + auVar21._16_4_ * fVar193 + fVar252 * auVar20._16_4_;
  auVar159._20_4_ = fVar211 * auVar19._20_4_ + auVar21._20_4_ * fVar248 + fVar213 * auVar20._20_4_;
  auVar159._24_4_ = fVar251 * auVar19._24_4_ + auVar21._24_4_ * fVar210 + fVar253 * auVar20._24_4_;
  auVar159._28_4_ = fVar235 + auVar21._28_4_ + auVar18._28_4_;
  auVar173._8_4_ = 0x7fffffff;
  auVar173._0_8_ = 0x7fffffff7fffffff;
  auVar173._12_4_ = 0x7fffffff;
  auVar173._16_4_ = 0x7fffffff;
  auVar173._20_4_ = 0x7fffffff;
  auVar173._24_4_ = 0x7fffffff;
  auVar173._28_4_ = 0x7fffffff;
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  auVar188._16_4_ = 0x219392ef;
  auVar188._20_4_ = 0x219392ef;
  auVar188._24_4_ = 0x219392ef;
  auVar188._28_4_ = 0x219392ef;
  auVar93 = vandps_avx(auVar305,auVar173);
  auVar93 = vcmpps_avx(auVar93,auVar188,1);
  auVar17 = vblendvps_avx(auVar305,auVar188,auVar93);
  auVar93 = vandps_avx(auVar297,auVar173);
  auVar93 = vcmpps_avx(auVar93,auVar188,1);
  auVar18 = vblendvps_avx(auVar297,auVar188,auVar93);
  auVar93 = vandps_avx(auVar226,auVar173);
  auVar93 = vcmpps_avx(auVar93,auVar188,1);
  auVar93 = vblendvps_avx(auVar226,auVar188,auVar93);
  auVar174._0_4_ = fVar250 * auVar22._0_4_ + fVar252 * auVar23._0_4_ + auVar24._0_4_ * fVar193;
  auVar174._4_4_ = fVar211 * auVar22._4_4_ + fVar213 * auVar23._4_4_ + auVar24._4_4_ * fVar248;
  auVar174._8_4_ = fVar251 * auVar22._8_4_ + fVar253 * auVar23._8_4_ + auVar24._8_4_ * fVar210;
  auVar174._12_4_ = fVar212 * auVar22._12_4_ + fVar214 * auVar23._12_4_ + auVar24._12_4_ * fVar249;
  auVar174._16_4_ = fVar250 * auVar22._16_4_ + fVar252 * auVar23._16_4_ + auVar24._16_4_ * fVar193;
  auVar174._20_4_ = fVar211 * auVar22._20_4_ + fVar213 * auVar23._20_4_ + auVar24._20_4_ * fVar248;
  auVar174._24_4_ = fVar251 * auVar22._24_4_ + fVar253 * auVar23._24_4_ + auVar24._24_4_ * fVar210;
  auVar174._28_4_ = fVar235 + fVar215;
  auVar19 = vrcpps_avx(auVar17);
  fVar235 = auVar19._0_4_;
  fVar248 = auVar19._4_4_;
  auVar20._4_4_ = auVar17._4_4_ * fVar248;
  auVar20._0_4_ = auVar17._0_4_ * fVar235;
  fVar249 = auVar19._8_4_;
  auVar20._8_4_ = auVar17._8_4_ * fVar249;
  fVar250 = auVar19._12_4_;
  auVar20._12_4_ = auVar17._12_4_ * fVar250;
  fVar251 = auVar19._16_4_;
  auVar20._16_4_ = auVar17._16_4_ * fVar251;
  fVar252 = auVar19._20_4_;
  auVar20._20_4_ = auVar17._20_4_ * fVar252;
  fVar253 = auVar19._24_4_;
  auVar20._24_4_ = auVar17._24_4_ * fVar253;
  auVar20._28_4_ = fVar215;
  auVar275._8_4_ = 0x3f800000;
  auVar275._0_8_ = 0x3f8000003f800000;
  auVar275._12_4_ = 0x3f800000;
  auVar275._16_4_ = 0x3f800000;
  auVar275._20_4_ = 0x3f800000;
  auVar275._24_4_ = 0x3f800000;
  auVar275._28_4_ = 0x3f800000;
  auVar20 = vsubps_avx(auVar275,auVar20);
  auVar17 = vrcpps_avx(auVar18);
  fVar235 = fVar235 + fVar235 * auVar20._0_4_;
  fVar248 = fVar248 + fVar248 * auVar20._4_4_;
  fVar249 = fVar249 + fVar249 * auVar20._8_4_;
  fVar250 = fVar250 + fVar250 * auVar20._12_4_;
  fVar251 = fVar251 + fVar251 * auVar20._16_4_;
  fVar252 = fVar252 + fVar252 * auVar20._20_4_;
  fVar253 = fVar253 + fVar253 * auVar20._24_4_;
  fVar193 = auVar17._0_4_;
  fVar210 = auVar17._4_4_;
  auVar21._4_4_ = auVar18._4_4_ * fVar210;
  auVar21._0_4_ = auVar18._0_4_ * fVar193;
  fVar215 = auVar17._8_4_;
  auVar21._8_4_ = auVar18._8_4_ * fVar215;
  fVar211 = auVar17._12_4_;
  auVar21._12_4_ = auVar18._12_4_ * fVar211;
  fVar212 = auVar17._16_4_;
  auVar21._16_4_ = auVar18._16_4_ * fVar212;
  fVar213 = auVar17._20_4_;
  auVar21._20_4_ = auVar18._20_4_ * fVar213;
  fVar214 = auVar17._24_4_;
  auVar21._24_4_ = auVar18._24_4_ * fVar214;
  auVar21._28_4_ = auVar19._28_4_;
  auVar17 = vsubps_avx(auVar275,auVar21);
  fVar193 = fVar193 + fVar193 * auVar17._0_4_;
  fVar210 = fVar210 + fVar210 * auVar17._4_4_;
  fVar215 = fVar215 + fVar215 * auVar17._8_4_;
  fVar211 = fVar211 + fVar211 * auVar17._12_4_;
  fVar212 = fVar212 + fVar212 * auVar17._16_4_;
  fVar213 = fVar213 + fVar213 * auVar17._20_4_;
  fVar214 = fVar214 + fVar214 * auVar17._24_4_;
  auVar17 = vrcpps_avx(auVar93);
  fVar216 = auVar17._0_4_;
  fVar228 = auVar17._4_4_;
  auVar18._4_4_ = fVar228 * auVar93._4_4_;
  auVar18._0_4_ = fVar216 * auVar93._0_4_;
  fVar229 = auVar17._8_4_;
  auVar18._8_4_ = fVar229 * auVar93._8_4_;
  fVar230 = auVar17._12_4_;
  auVar18._12_4_ = fVar230 * auVar93._12_4_;
  fVar231 = auVar17._16_4_;
  auVar18._16_4_ = fVar231 * auVar93._16_4_;
  fVar233 = auVar17._20_4_;
  auVar18._20_4_ = fVar233 * auVar93._20_4_;
  fVar234 = auVar17._24_4_;
  auVar18._24_4_ = fVar234 * auVar93._24_4_;
  auVar18._28_4_ = auVar93._28_4_;
  auVar93 = vsubps_avx(auVar275,auVar18);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar82 = vpmovsxwd_avx(auVar82);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + uVar69 * 7 + 0xe);
  auVar221 = vpmovsxwd_avx(auVar221);
  fVar216 = fVar216 + fVar216 * auVar93._0_4_;
  fVar228 = fVar228 + fVar228 * auVar93._4_4_;
  fVar229 = fVar229 + fVar229 * auVar93._8_4_;
  fVar230 = fVar230 + fVar230 * auVar93._12_4_;
  fVar231 = fVar231 + fVar231 * auVar93._16_4_;
  fVar233 = fVar233 + fVar233 * auVar93._20_4_;
  fVar234 = fVar234 + fVar234 * auVar93._24_4_;
  auVar94._16_16_ = auVar221;
  auVar94._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar94);
  auVar93 = vsubps_avx(auVar93,auVar127);
  auVar77._0_4_ = fVar235 * auVar93._0_4_;
  auVar77._4_4_ = fVar248 * auVar93._4_4_;
  auVar77._8_4_ = fVar249 * auVar93._8_4_;
  auVar77._12_4_ = fVar250 * auVar93._12_4_;
  auVar19._16_4_ = fVar251 * auVar93._16_4_;
  auVar19._0_16_ = auVar77;
  auVar19._20_4_ = fVar252 * auVar93._20_4_;
  auVar19._24_4_ = fVar253 * auVar93._24_4_;
  auVar19._28_4_ = auVar93._28_4_;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar69 * 9 + 6);
  auVar82 = vpmovsxwd_avx(auVar156);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar69 * 9 + 0xe);
  auVar221 = vpmovsxwd_avx(auVar8);
  auVar189._16_16_ = auVar221;
  auVar189._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar189);
  auVar93 = vsubps_avx(auVar93,auVar127);
  auVar293._8_8_ = 0;
  auVar293._0_8_ = *(ulong *)(prim + uVar69 * 0xe + 6);
  auVar82 = vpmovsxwd_avx(auVar293);
  auVar105._0_4_ = fVar235 * auVar93._0_4_;
  auVar105._4_4_ = fVar248 * auVar93._4_4_;
  auVar105._8_4_ = fVar249 * auVar93._8_4_;
  auVar105._12_4_ = fVar250 * auVar93._12_4_;
  auVar22._16_4_ = fVar251 * auVar93._16_4_;
  auVar22._0_16_ = auVar105;
  auVar22._20_4_ = fVar252 * auVar93._20_4_;
  auVar22._24_4_ = fVar253 * auVar93._24_4_;
  auVar22._28_4_ = auVar93._28_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar69 * 0xe + 0xe);
  auVar221 = vpmovsxwd_avx(auVar9);
  auVar190._16_16_ = auVar221;
  auVar190._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar190);
  auVar93 = vsubps_avx(auVar93,auVar159);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar82 = vpmovsxwd_avx(auVar122);
  auVar176._0_4_ = fVar193 * auVar93._0_4_;
  auVar176._4_4_ = fVar210 * auVar93._4_4_;
  auVar176._8_4_ = fVar215 * auVar93._8_4_;
  auVar176._12_4_ = fVar211 * auVar93._12_4_;
  auVar23._16_4_ = fVar212 * auVar93._16_4_;
  auVar23._0_16_ = auVar176;
  auVar23._20_4_ = fVar213 * auVar93._20_4_;
  auVar23._24_4_ = fVar214 * auVar93._24_4_;
  auVar23._28_4_ = auVar93._28_4_;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 0xe);
  auVar221 = vpmovsxwd_avx(auVar110);
  auVar245._16_16_ = auVar221;
  auVar245._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar245);
  auVar93 = vsubps_avx(auVar93,auVar159);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar69 * 0x15 + 6);
  auVar82 = vpmovsxwd_avx(auVar142);
  auVar136._0_4_ = fVar193 * auVar93._0_4_;
  auVar136._4_4_ = fVar210 * auVar93._4_4_;
  auVar136._8_4_ = fVar215 * auVar93._8_4_;
  auVar136._12_4_ = fVar211 * auVar93._12_4_;
  auVar24._16_4_ = fVar212 * auVar93._16_4_;
  auVar24._0_16_ = auVar136;
  auVar24._20_4_ = fVar213 * auVar93._20_4_;
  auVar24._24_4_ = fVar214 * auVar93._24_4_;
  auVar24._28_4_ = auVar93._28_4_;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar69 * 0x15 + 0xe);
  auVar221 = vpmovsxwd_avx(auVar111);
  auVar207._16_16_ = auVar221;
  auVar207._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar207);
  auVar93 = vsubps_avx(auVar93,auVar174);
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + uVar69 * 0x17 + 6);
  auVar82 = vpmovsxwd_avx(auVar232);
  auVar194._0_4_ = fVar216 * auVar93._0_4_;
  auVar194._4_4_ = fVar228 * auVar93._4_4_;
  auVar194._8_4_ = fVar229 * auVar93._8_4_;
  auVar194._12_4_ = fVar230 * auVar93._12_4_;
  auVar25._16_4_ = fVar231 * auVar93._16_4_;
  auVar25._0_16_ = auVar194;
  auVar25._20_4_ = fVar233 * auVar93._20_4_;
  auVar25._24_4_ = fVar234 * auVar93._24_4_;
  auVar25._28_4_ = auVar93._28_4_;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *(ulong *)(prim + uVar69 * 0x17 + 0xe);
  auVar221 = vpmovsxwd_avx(auVar269);
  auVar246._16_16_ = auVar221;
  auVar246._0_16_ = auVar82;
  auVar93 = vcvtdq2ps_avx(auVar246);
  auVar93 = vsubps_avx(auVar93,auVar174);
  auVar164._0_4_ = fVar216 * auVar93._0_4_;
  auVar164._4_4_ = fVar228 * auVar93._4_4_;
  auVar164._8_4_ = fVar229 * auVar93._8_4_;
  auVar164._12_4_ = fVar230 * auVar93._12_4_;
  auVar26._16_4_ = fVar231 * auVar93._16_4_;
  auVar26._0_16_ = auVar164;
  auVar26._20_4_ = fVar233 * auVar93._20_4_;
  auVar26._24_4_ = fVar234 * auVar93._24_4_;
  auVar26._28_4_ = auVar93._28_4_;
  auVar82 = vpminsd_avx(auVar19._16_16_,auVar22._16_16_);
  auVar221 = vpminsd_avx(auVar77,auVar105);
  auVar289._16_16_ = auVar82;
  auVar289._0_16_ = auVar221;
  auVar82 = vpminsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar221 = vpminsd_avx(auVar176,auVar136);
  auVar298._16_16_ = auVar82;
  auVar298._0_16_ = auVar221;
  auVar93 = vmaxps_avx(auVar289,auVar298);
  auVar82 = vpminsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar221 = vpminsd_avx(auVar194,auVar164);
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar336._4_4_ = uVar74;
  auVar336._0_4_ = uVar74;
  auVar336._8_4_ = uVar74;
  auVar336._12_4_ = uVar74;
  auVar336._16_4_ = uVar74;
  auVar336._20_4_ = uVar74;
  auVar336._24_4_ = uVar74;
  auVar336._28_4_ = uVar74;
  auVar316._16_16_ = auVar82;
  auVar316._0_16_ = auVar221;
  auVar17 = vmaxps_avx(auVar316,auVar336);
  auVar93 = vmaxps_avx(auVar93,auVar17);
  local_300._4_4_ = auVar93._4_4_ * 0.99999964;
  local_300._0_4_ = auVar93._0_4_ * 0.99999964;
  local_300._8_4_ = auVar93._8_4_ * 0.99999964;
  local_300._12_4_ = auVar93._12_4_ * 0.99999964;
  local_300._16_4_ = auVar93._16_4_ * 0.99999964;
  local_300._20_4_ = auVar93._20_4_ * 0.99999964;
  local_300._24_4_ = auVar93._24_4_ * 0.99999964;
  local_300._28_4_ = auVar93._28_4_;
  auVar82 = vpmaxsd_avx(auVar19._16_16_,auVar22._16_16_);
  auVar221 = vpmaxsd_avx(auVar77,auVar105);
  auVar95._16_16_ = auVar82;
  auVar95._0_16_ = auVar221;
  auVar82 = vpmaxsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar221 = vpmaxsd_avx(auVar176,auVar136);
  auVar128._16_16_ = auVar82;
  auVar128._0_16_ = auVar221;
  auVar93 = vminps_avx(auVar95,auVar128);
  auVar82 = vpmaxsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar221 = vpmaxsd_avx(auVar194,auVar164);
  auVar129._16_16_ = auVar82;
  auVar129._0_16_ = auVar221;
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar160._4_4_ = uVar74;
  auVar160._0_4_ = uVar74;
  auVar160._8_4_ = uVar74;
  auVar160._12_4_ = uVar74;
  auVar160._16_4_ = uVar74;
  auVar160._20_4_ = uVar74;
  auVar160._24_4_ = uVar74;
  auVar160._28_4_ = uVar74;
  auVar17 = vminps_avx(auVar129,auVar160);
  auVar93 = vminps_avx(auVar93,auVar17);
  auVar17._4_4_ = auVar93._4_4_ * 1.0000004;
  auVar17._0_4_ = auVar93._0_4_ * 1.0000004;
  auVar17._8_4_ = auVar93._8_4_ * 1.0000004;
  auVar17._12_4_ = auVar93._12_4_ * 1.0000004;
  auVar17._16_4_ = auVar93._16_4_ * 1.0000004;
  auVar17._20_4_ = auVar93._20_4_ * 1.0000004;
  auVar17._24_4_ = auVar93._24_4_ * 1.0000004;
  auVar17._28_4_ = auVar93._28_4_;
  auVar93 = vcmpps_avx(local_300,auVar17,2);
  auVar82 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar130._16_16_ = auVar82;
  auVar130._0_16_ = auVar82;
  auVar17 = vcvtdq2ps_avx(auVar130);
  auVar17 = vcmpps_avx(_DAT_01f7b060,auVar17,1);
  auVar93 = vandps_avx(auVar93,auVar17);
  uVar74 = vmovmskps_avx(auVar93);
  uVar69 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar74);
  auVar96._16_16_ = mm_lookupmask_ps._240_16_;
  auVar96._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar96,ZEXT832(0) << 0x20,0x80);
  uVar66 = 1 << ((byte)k & 0x1f);
LAB_0099e156:
  if (uVar69 == 0) {
LAB_009a0079:
    return uVar69 != 0;
  }
  lVar70 = 0;
  if (uVar69 != 0) {
    for (; (uVar69 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
    }
  }
  uVar68 = *(uint *)(prim + 2);
  pGVar11 = (context->scene->geometries).items[uVar68].ptr;
  uVar73 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                           pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar70 * 4 + 6));
  p_Var12 = pGVar11[1].intersectionFilterN;
  pvVar13 = pGVar11[2].userPtr;
  _Var14 = pGVar11[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var14 + uVar73 * (long)pvVar13);
  fVar235 = *pfVar1;
  fVar193 = pfVar1[1];
  fVar248 = pfVar1[2];
  fVar210 = pfVar1[3];
  pfVar1 = (float *)(_Var14 + (uVar73 + 1) * (long)pvVar13);
  pfVar2 = (float *)(_Var14 + (uVar73 + 2) * (long)pvVar13);
  pfVar3 = (float *)(_Var14 + (long)pvVar13 * (uVar73 + 3));
  fVar249 = *pfVar3;
  fVar215 = pfVar3[1];
  fVar250 = pfVar3[2];
  fVar211 = pfVar3[3];
  lVar15 = *(long *)&pGVar11[1].time_range.upper;
  pfVar3 = (float *)(lVar15 + (long)p_Var12 * uVar73);
  fVar251 = *pfVar3;
  fVar212 = pfVar3[1];
  fVar252 = pfVar3[2];
  fVar213 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + (long)p_Var12 * (uVar73 + 1));
  uVar76 = uVar69 - 1 & uVar69;
  pfVar4 = (float *)(lVar15 + (long)p_Var12 * (uVar73 + 2));
  lVar16 = 0;
  if (uVar76 != 0) {
    for (; (uVar76 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
    }
  }
  pfVar5 = (float *)(lVar15 + (long)p_Var12 * (uVar73 + 3));
  fVar253 = *pfVar5;
  fVar214 = pfVar5[1];
  fVar216 = pfVar5[2];
  fVar228 = pfVar5[3];
  if (((uVar76 != 0) && (uVar73 = uVar76 - 1 & uVar76, uVar73 != 0)) && (lVar15 = 0, uVar73 != 0)) {
    for (; (uVar73 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
    }
  }
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar156 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar229 = *pfVar4 * 0.0;
  fVar230 = pfVar4[1] * 0.0;
  fVar231 = pfVar4[2] * 0.0;
  fVar233 = pfVar4[3] * 0.0;
  fVar234 = fVar229 + fVar253 * 0.0;
  fVar300 = fVar230 + fVar214 * 0.0;
  fVar301 = fVar231 + fVar216 * 0.0;
  fVar302 = fVar233 + fVar228 * 0.0;
  fVar303 = *pfVar3 * 0.0;
  fVar306 = pfVar3[1] * 0.0;
  fVar307 = pfVar3[2] * 0.0;
  fVar308 = pfVar3[3] * 0.0;
  local_720._0_4_ = fVar251 + fVar303 + fVar234;
  local_720._4_4_ = fVar212 + fVar306 + fVar300;
  fStack_718 = fVar252 + fVar307 + fVar301;
  fStack_714 = fVar213 + fVar308 + fVar302;
  auVar137._0_4_ = fVar234 + *pfVar3 * 3.0;
  auVar137._4_4_ = fVar300 + pfVar3[1] * 3.0;
  auVar137._8_4_ = fVar301 + pfVar3[2] * 3.0;
  auVar137._12_4_ = fVar302 + pfVar3[3] * 3.0;
  auVar291._0_4_ = fVar251 * 3.0;
  auVar291._4_4_ = fVar212 * 3.0;
  auVar291._8_4_ = fVar252 * 3.0;
  auVar291._12_4_ = fVar213 * 3.0;
  auVar142 = vsubps_avx(auVar137,auVar291);
  fVar313 = *pfVar2 * 0.0;
  fVar317 = pfVar2[1] * 0.0;
  fVar318 = pfVar2[2] * 0.0;
  fVar319 = pfVar2[3] * 0.0;
  fVar234 = fVar313 + fVar249 * 0.0;
  fVar300 = fVar317 + fVar215 * 0.0;
  fVar301 = fVar318 + fVar250 * 0.0;
  fVar302 = fVar319 + fVar211 * 0.0;
  fVar321 = *pfVar1 * 0.0;
  fVar330 = pfVar1[1] * 0.0;
  fVar331 = pfVar1[2] * 0.0;
  fVar332 = pfVar1[3] * 0.0;
  auVar333._0_4_ = fVar321 + fVar234 + fVar235;
  auVar333._4_4_ = fVar330 + fVar300 + fVar193;
  auVar333._8_4_ = fVar331 + fVar301 + fVar248;
  auVar333._12_4_ = fVar332 + fVar302 + fVar210;
  auVar165._0_4_ = fVar234 + *pfVar1 * 3.0;
  auVar165._4_4_ = fVar300 + pfVar1[1] * 3.0;
  auVar165._8_4_ = fVar301 + pfVar1[2] * 3.0;
  auVar165._12_4_ = fVar302 + pfVar1[3] * 3.0;
  auVar292._0_4_ = fVar235 * 3.0;
  auVar292._4_4_ = fVar193 * 3.0;
  auVar292._8_4_ = fVar248 * 3.0;
  auVar292._12_4_ = fVar210 * 3.0;
  auVar293 = vsubps_avx(auVar165,auVar292);
  auVar177._0_4_ = fVar251 * 0.0;
  auVar177._4_4_ = fVar212 * 0.0;
  auVar177._8_4_ = fVar252 * 0.0;
  auVar177._12_4_ = fVar213 * 0.0;
  auVar166._0_4_ = auVar177._0_4_ + fVar303 + fVar229 + fVar253;
  auVar166._4_4_ = auVar177._4_4_ + fVar306 + fVar230 + fVar214;
  auVar166._8_4_ = auVar177._8_4_ + fVar307 + fVar231 + fVar216;
  auVar166._12_4_ = auVar177._12_4_ + fVar308 + fVar233 + fVar228;
  auVar265._0_4_ = fVar253 * 3.0;
  auVar265._4_4_ = fVar214 * 3.0;
  auVar265._8_4_ = fVar216 * 3.0;
  auVar265._12_4_ = fVar228 * 3.0;
  auVar254._0_4_ = *pfVar4 * 3.0;
  auVar254._4_4_ = pfVar4[1] * 3.0;
  auVar254._8_4_ = pfVar4[2] * 3.0;
  auVar254._12_4_ = pfVar4[3] * 3.0;
  auVar82 = vsubps_avx(auVar265,auVar254);
  auVar255._0_4_ = fVar303 + auVar82._0_4_;
  auVar255._4_4_ = fVar306 + auVar82._4_4_;
  auVar255._8_4_ = fVar307 + auVar82._8_4_;
  auVar255._12_4_ = fVar308 + auVar82._12_4_;
  auVar111 = vsubps_avx(auVar255,auVar177);
  auVar195._0_4_ = fVar235 * 0.0;
  auVar195._4_4_ = fVar193 * 0.0;
  auVar195._8_4_ = fVar248 * 0.0;
  auVar195._12_4_ = fVar210 * 0.0;
  auVar266._0_4_ = fVar321 + fVar313 + fVar249 + auVar195._0_4_;
  auVar266._4_4_ = fVar330 + fVar317 + fVar215 + auVar195._4_4_;
  auVar266._8_4_ = fVar331 + fVar318 + fVar250 + auVar195._8_4_;
  auVar266._12_4_ = fVar332 + fVar319 + fVar211 + auVar195._12_4_;
  auVar236._0_4_ = fVar249 * 3.0;
  auVar236._4_4_ = fVar215 * 3.0;
  auVar236._8_4_ = fVar250 * 3.0;
  auVar236._12_4_ = fVar211 * 3.0;
  auVar218._0_4_ = *pfVar2 * 3.0;
  auVar218._4_4_ = pfVar2[1] * 3.0;
  auVar218._8_4_ = pfVar2[2] * 3.0;
  auVar218._12_4_ = pfVar2[3] * 3.0;
  auVar82 = vsubps_avx(auVar236,auVar218);
  auVar219._0_4_ = fVar321 + auVar82._0_4_;
  auVar219._4_4_ = fVar330 + auVar82._4_4_;
  auVar219._8_4_ = fVar331 + auVar82._8_4_;
  auVar219._12_4_ = fVar332 + auVar82._12_4_;
  auVar122 = vsubps_avx(auVar219,auVar195);
  auVar82 = vshufps_avx(auVar142,auVar142,0xc9);
  auVar221 = vshufps_avx(auVar333,auVar333,0xc9);
  fVar229 = auVar142._0_4_;
  auVar237._0_4_ = fVar229 * auVar221._0_4_;
  fVar230 = auVar142._4_4_;
  auVar237._4_4_ = fVar230 * auVar221._4_4_;
  fVar231 = auVar142._8_4_;
  auVar237._8_4_ = fVar231 * auVar221._8_4_;
  fVar233 = auVar142._12_4_;
  auVar237._12_4_ = fVar233 * auVar221._12_4_;
  auVar256._0_4_ = auVar333._0_4_ * auVar82._0_4_;
  auVar256._4_4_ = auVar333._4_4_ * auVar82._4_4_;
  auVar256._8_4_ = auVar333._8_4_ * auVar82._8_4_;
  auVar256._12_4_ = auVar333._12_4_ * auVar82._12_4_;
  auVar221 = vsubps_avx(auVar256,auVar237);
  auVar8 = vshufps_avx(auVar221,auVar221,0xc9);
  auVar221 = vshufps_avx(auVar293,auVar293,0xc9);
  auVar238._0_4_ = fVar229 * auVar221._0_4_;
  auVar238._4_4_ = fVar230 * auVar221._4_4_;
  auVar238._8_4_ = fVar231 * auVar221._8_4_;
  auVar238._12_4_ = fVar233 * auVar221._12_4_;
  auVar196._0_4_ = auVar293._0_4_ * auVar82._0_4_;
  auVar196._4_4_ = auVar293._4_4_ * auVar82._4_4_;
  auVar196._8_4_ = auVar293._8_4_ * auVar82._8_4_;
  auVar196._12_4_ = auVar293._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar196,auVar238);
  auVar293 = vshufps_avx(auVar82,auVar82,0xc9);
  auVar221 = vshufps_avx(auVar111,auVar111,0xc9);
  auVar82 = vshufps_avx(auVar266,auVar266,0xc9);
  fVar234 = auVar111._0_4_;
  auVar197._0_4_ = fVar234 * auVar82._0_4_;
  fVar300 = auVar111._4_4_;
  auVar197._4_4_ = fVar300 * auVar82._4_4_;
  fVar301 = auVar111._8_4_;
  auVar197._8_4_ = fVar301 * auVar82._8_4_;
  fVar302 = auVar111._12_4_;
  auVar197._12_4_ = fVar302 * auVar82._12_4_;
  auVar267._0_4_ = auVar266._0_4_ * auVar221._0_4_;
  auVar267._4_4_ = auVar266._4_4_ * auVar221._4_4_;
  auVar267._8_4_ = auVar266._8_4_ * auVar221._8_4_;
  auVar267._12_4_ = auVar266._12_4_ * auVar221._12_4_;
  auVar82 = vsubps_avx(auVar267,auVar197);
  auVar9 = vshufps_avx(auVar82,auVar82,0xc9);
  auVar82 = vshufps_avx(auVar122,auVar122,0xc9);
  auVar268._0_4_ = auVar82._0_4_ * fVar234;
  auVar268._4_4_ = auVar82._4_4_ * fVar300;
  auVar268._8_4_ = auVar82._8_4_ * fVar301;
  auVar268._12_4_ = auVar82._12_4_ * fVar302;
  auVar82 = vdpps_avx(auVar8,auVar8,0x7f);
  auVar220._0_4_ = auVar221._0_4_ * auVar122._0_4_;
  auVar220._4_4_ = auVar221._4_4_ * auVar122._4_4_;
  auVar220._8_4_ = auVar221._8_4_ * auVar122._8_4_;
  auVar220._12_4_ = auVar221._12_4_ * auVar122._12_4_;
  auVar221 = vsubps_avx(auVar220,auVar268);
  auVar122 = vshufps_avx(auVar221,auVar221,0xc9);
  fVar249 = auVar82._0_4_;
  auVar269 = ZEXT416((uint)fVar249);
  auVar221 = vrsqrtss_avx(auVar269,auVar269);
  fVar235 = auVar221._0_4_;
  auVar221 = ZEXT416((uint)(fVar235 * 1.5 - fVar249 * 0.5 * fVar235 * fVar235 * fVar235));
  auVar110 = vshufps_avx(auVar221,auVar221,0);
  auVar221 = vdpps_avx(auVar8,auVar293,0x7f);
  fVar235 = auVar8._0_4_ * auVar110._0_4_;
  fVar193 = auVar8._4_4_ * auVar110._4_4_;
  fVar248 = auVar8._8_4_ * auVar110._8_4_;
  fVar210 = auVar8._12_4_ * auVar110._12_4_;
  auVar82 = vshufps_avx(auVar82,auVar82,0);
  auVar282._0_4_ = auVar293._0_4_ * auVar82._0_4_;
  auVar282._4_4_ = auVar293._4_4_ * auVar82._4_4_;
  auVar282._8_4_ = auVar293._8_4_ * auVar82._8_4_;
  auVar282._12_4_ = auVar293._12_4_ * auVar82._12_4_;
  auVar82 = vshufps_avx(auVar221,auVar221,0);
  auVar257._0_4_ = auVar8._0_4_ * auVar82._0_4_;
  auVar257._4_4_ = auVar8._4_4_ * auVar82._4_4_;
  auVar257._8_4_ = auVar8._8_4_ * auVar82._8_4_;
  auVar257._12_4_ = auVar8._12_4_ * auVar82._12_4_;
  auVar232 = vsubps_avx(auVar282,auVar257);
  auVar82 = vrcpss_avx(auVar269,auVar269);
  auVar82 = ZEXT416((uint)(auVar82._0_4_ * (2.0 - fVar249 * auVar82._0_4_)));
  auVar8 = vshufps_avx(auVar82,auVar82,0);
  auVar82 = vdpps_avx(auVar9,auVar9,0x7f);
  fVar249 = auVar82._0_4_;
  auVar269 = ZEXT416((uint)fVar249);
  auVar221 = vrsqrtss_avx(auVar269,auVar269);
  fVar215 = auVar221._0_4_;
  auVar221 = vdpps_avx(auVar9,auVar122,0x7f);
  auVar293 = ZEXT416((uint)(fVar215 * 1.5 - fVar249 * 0.5 * fVar215 * fVar215 * fVar215));
  auVar293 = vshufps_avx(auVar293,auVar293,0);
  fVar215 = auVar293._0_4_ * auVar9._0_4_;
  fVar250 = auVar293._4_4_ * auVar9._4_4_;
  fVar211 = auVar293._8_4_ * auVar9._8_4_;
  fVar251 = auVar293._12_4_ * auVar9._12_4_;
  auVar82 = vshufps_avx(auVar82,auVar82,0);
  auVar239._0_4_ = auVar82._0_4_ * auVar122._0_4_;
  auVar239._4_4_ = auVar82._4_4_ * auVar122._4_4_;
  auVar239._8_4_ = auVar82._8_4_ * auVar122._8_4_;
  auVar239._12_4_ = auVar82._12_4_ * auVar122._12_4_;
  auVar82 = vshufps_avx(auVar221,auVar221,0);
  auVar198._0_4_ = auVar82._0_4_ * auVar9._0_4_;
  auVar198._4_4_ = auVar82._4_4_ * auVar9._4_4_;
  auVar198._8_4_ = auVar82._8_4_ * auVar9._8_4_;
  auVar198._12_4_ = auVar82._12_4_ * auVar9._12_4_;
  auVar122 = vsubps_avx(auVar239,auVar198);
  auVar82 = vrcpss_avx(auVar269,auVar269);
  auVar82 = ZEXT416((uint)((2.0 - fVar249 * auVar82._0_4_) * auVar82._0_4_));
  auVar82 = vshufps_avx(auVar82,auVar82,0);
  auVar221 = vshufps_avx(_local_720,_local_720,0xff);
  auVar270._0_4_ = auVar221._0_4_ * fVar235;
  auVar270._4_4_ = auVar221._4_4_ * fVar193;
  auVar270._8_4_ = auVar221._8_4_ * fVar248;
  auVar270._12_4_ = auVar221._12_4_ * fVar210;
  _local_4e0 = vsubps_avx(_local_720,auVar270);
  auVar9 = vshufps_avx(auVar142,auVar142,0xff);
  auVar222._0_4_ =
       auVar9._0_4_ * fVar235 + auVar110._0_4_ * auVar232._0_4_ * auVar8._0_4_ * auVar221._0_4_;
  auVar222._4_4_ =
       auVar9._4_4_ * fVar193 + auVar110._4_4_ * auVar232._4_4_ * auVar8._4_4_ * auVar221._4_4_;
  auVar222._8_4_ =
       auVar9._8_4_ * fVar248 + auVar110._8_4_ * auVar232._8_4_ * auVar8._8_4_ * auVar221._8_4_;
  auVar222._12_4_ =
       auVar9._12_4_ * fVar210 + auVar110._12_4_ * auVar232._12_4_ * auVar8._12_4_ * auVar221._12_4_
  ;
  auVar9 = vsubps_avx(auVar142,auVar222);
  local_4f0._0_4_ = auVar270._0_4_ + (float)local_720._0_4_;
  local_4f0._4_4_ = auVar270._4_4_ + (float)local_720._4_4_;
  fStack_4e8 = auVar270._8_4_ + fStack_718;
  fStack_4e4 = auVar270._12_4_ + fStack_714;
  auVar221 = vshufps_avx(auVar166,auVar166,0xff);
  auVar138._0_4_ = fVar215 * auVar221._0_4_;
  auVar138._4_4_ = fVar250 * auVar221._4_4_;
  auVar138._8_4_ = fVar211 * auVar221._8_4_;
  auVar138._12_4_ = fVar251 * auVar221._12_4_;
  _local_500 = vsubps_avx(auVar166,auVar138);
  auVar8 = vshufps_avx(auVar111,auVar111,0xff);
  auVar106._0_4_ =
       fVar215 * auVar8._0_4_ + auVar221._0_4_ * auVar293._0_4_ * auVar122._0_4_ * auVar82._0_4_;
  auVar106._4_4_ =
       fVar250 * auVar8._4_4_ + auVar221._4_4_ * auVar293._4_4_ * auVar122._4_4_ * auVar82._4_4_;
  auVar106._8_4_ =
       fVar211 * auVar8._8_4_ + auVar221._8_4_ * auVar293._8_4_ * auVar122._8_4_ * auVar82._8_4_;
  auVar106._12_4_ =
       fVar251 * auVar8._12_4_ +
       auVar221._12_4_ * auVar293._12_4_ * auVar122._12_4_ * auVar82._12_4_;
  auVar293 = vsubps_avx(auVar111,auVar106);
  local_510._0_4_ = auVar166._0_4_ + auVar138._0_4_;
  local_510._4_4_ = auVar166._4_4_ + auVar138._4_4_;
  fStack_508 = auVar166._8_4_ + auVar138._8_4_;
  fStack_504 = auVar166._12_4_ + auVar138._12_4_;
  local_520._0_4_ = local_4e0._0_4_ + auVar9._0_4_ * 0.33333334;
  local_520._4_4_ = local_4e0._4_4_ + auVar9._4_4_ * 0.33333334;
  fStack_518 = local_4e0._8_4_ + auVar9._8_4_ * 0.33333334;
  fStack_514 = local_4e0._12_4_ + auVar9._12_4_ * 0.33333334;
  local_3c0 = vsubps_avx(_local_4e0,auVar156);
  auVar221 = vmovsldup_avx(local_3c0);
  auVar82 = vmovshdup_avx(local_3c0);
  auVar8 = vshufps_avx(local_3c0,local_3c0,0xaa);
  fVar235 = pre->ray_space[k].vx.field_0.m128[0];
  fVar193 = pre->ray_space[k].vx.field_0.m128[1];
  fVar248 = pre->ray_space[k].vx.field_0.m128[2];
  fVar210 = pre->ray_space[k].vx.field_0.m128[3];
  fVar249 = pre->ray_space[k].vy.field_0.m128[0];
  fVar215 = pre->ray_space[k].vy.field_0.m128[1];
  fVar250 = pre->ray_space[k].vy.field_0.m128[2];
  fVar211 = pre->ray_space[k].vy.field_0.m128[3];
  fVar251 = pre->ray_space[k].vz.field_0.m128[0];
  fVar212 = pre->ray_space[k].vz.field_0.m128[1];
  fVar252 = pre->ray_space[k].vz.field_0.m128[2];
  fVar213 = pre->ray_space[k].vz.field_0.m128[3];
  fVar253 = fVar235 * auVar221._0_4_ + auVar8._0_4_ * fVar251 + fVar249 * auVar82._0_4_;
  fVar216 = fVar193 * auVar221._4_4_ + auVar8._4_4_ * fVar212 + fVar215 * auVar82._4_4_;
  local_720._4_4_ = fVar216;
  local_720._0_4_ = fVar253;
  fStack_718 = fVar248 * auVar221._8_4_ + auVar8._8_4_ * fVar252 + fVar250 * auVar82._8_4_;
  fStack_714 = fVar210 * auVar221._12_4_ + auVar8._12_4_ * fVar213 + fVar211 * auVar82._12_4_;
  local_3d0 = vsubps_avx(_local_520,auVar156);
  auVar8 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar82 = vmovshdup_avx(local_3d0);
  auVar221 = vmovsldup_avx(local_3d0);
  fVar214 = auVar221._0_4_ * fVar235 + auVar82._0_4_ * fVar249 + fVar251 * auVar8._0_4_;
  fVar228 = auVar221._4_4_ * fVar193 + auVar82._4_4_ * fVar215 + fVar212 * auVar8._4_4_;
  local_6d0._4_4_ = fVar228;
  local_6d0._0_4_ = fVar214;
  fStack_6c8 = auVar221._8_4_ * fVar248 + auVar82._8_4_ * fVar250 + fVar252 * auVar8._8_4_;
  fStack_6c4 = auVar221._12_4_ * fVar210 + auVar82._12_4_ * fVar211 + fVar213 * auVar8._12_4_;
  auVar199._0_4_ = auVar293._0_4_ * 0.33333334;
  auVar199._4_4_ = auVar293._4_4_ * 0.33333334;
  auVar199._8_4_ = auVar293._8_4_ * 0.33333334;
  auVar199._12_4_ = auVar293._12_4_ * 0.33333334;
  _local_530 = vsubps_avx(_local_500,auVar199);
  local_3e0 = vsubps_avx(_local_530,auVar156);
  auVar8 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar82 = vmovshdup_avx(local_3e0);
  auVar221 = vmovsldup_avx(local_3e0);
  auVar322._0_4_ = auVar221._0_4_ * fVar235 + auVar82._0_4_ * fVar249 + fVar251 * auVar8._0_4_;
  auVar322._4_4_ = auVar221._4_4_ * fVar193 + auVar82._4_4_ * fVar215 + fVar212 * auVar8._4_4_;
  auVar322._8_4_ = auVar221._8_4_ * fVar248 + auVar82._8_4_ * fVar250 + fVar252 * auVar8._8_4_;
  auVar322._12_4_ = auVar221._12_4_ * fVar210 + auVar82._12_4_ * fVar211 + fVar213 * auVar8._12_4_;
  local_3f0 = vsubps_avx(_local_500,auVar156);
  auVar8 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar82 = vmovshdup_avx(local_3f0);
  auVar221 = vmovsldup_avx(local_3f0);
  auVar314._0_4_ = auVar221._0_4_ * fVar235 + auVar82._0_4_ * fVar249 + auVar8._0_4_ * fVar251;
  auVar314._4_4_ = auVar221._4_4_ * fVar193 + auVar82._4_4_ * fVar215 + auVar8._4_4_ * fVar212;
  auVar314._8_4_ = auVar221._8_4_ * fVar248 + auVar82._8_4_ * fVar250 + auVar8._8_4_ * fVar252;
  auVar314._12_4_ = auVar221._12_4_ * fVar210 + auVar82._12_4_ * fVar211 + auVar8._12_4_ * fVar213;
  local_400 = vsubps_avx(_local_4f0,auVar156);
  auVar8 = vshufps_avx(local_400,local_400,0xaa);
  auVar82 = vmovshdup_avx(local_400);
  auVar221 = vmovsldup_avx(local_400);
  auVar283._0_4_ = auVar221._0_4_ * fVar235 + auVar82._0_4_ * fVar249 + auVar8._0_4_ * fVar251;
  auVar283._4_4_ = auVar221._4_4_ * fVar193 + auVar82._4_4_ * fVar215 + auVar8._4_4_ * fVar212;
  auVar283._8_4_ = auVar221._8_4_ * fVar248 + auVar82._8_4_ * fVar250 + auVar8._8_4_ * fVar252;
  auVar283._12_4_ = auVar221._12_4_ * fVar210 + auVar82._12_4_ * fVar211 + auVar8._12_4_ * fVar213;
  local_540._0_4_ = (float)local_4f0._0_4_ + (fVar229 + auVar222._0_4_) * 0.33333334;
  local_540._4_4_ = (float)local_4f0._4_4_ + (fVar230 + auVar222._4_4_) * 0.33333334;
  fStack_538 = fStack_4e8 + (fVar231 + auVar222._8_4_) * 0.33333334;
  fStack_534 = fStack_4e4 + (fVar233 + auVar222._12_4_) * 0.33333334;
  local_410 = vsubps_avx(_local_540,auVar156);
  auVar8 = vshufps_avx(local_410,local_410,0xaa);
  auVar82 = vmovshdup_avx(local_410);
  auVar221 = vmovsldup_avx(local_410);
  auVar258._0_4_ = auVar221._0_4_ * fVar235 + auVar82._0_4_ * fVar249 + auVar8._0_4_ * fVar251;
  auVar258._4_4_ = auVar221._4_4_ * fVar193 + auVar82._4_4_ * fVar215 + auVar8._4_4_ * fVar212;
  auVar258._8_4_ = auVar221._8_4_ * fVar248 + auVar82._8_4_ * fVar250 + auVar8._8_4_ * fVar252;
  auVar258._12_4_ = auVar221._12_4_ * fVar210 + auVar82._12_4_ * fVar211 + auVar8._12_4_ * fVar213;
  auVar240._0_4_ = (fVar234 + auVar106._0_4_) * 0.33333334;
  auVar240._4_4_ = (fVar300 + auVar106._4_4_) * 0.33333334;
  auVar240._8_4_ = (fVar301 + auVar106._8_4_) * 0.33333334;
  auVar240._12_4_ = (fVar302 + auVar106._12_4_) * 0.33333334;
  _local_450 = vsubps_avx(_local_510,auVar240);
  local_420 = vsubps_avx(_local_450,auVar156);
  auVar8 = vshufps_avx(local_420,local_420,0xaa);
  auVar82 = vmovshdup_avx(local_420);
  auVar221 = vmovsldup_avx(local_420);
  auVar271._0_4_ = auVar221._0_4_ * fVar235 + auVar82._0_4_ * fVar249 + fVar251 * auVar8._0_4_;
  auVar271._4_4_ = auVar221._4_4_ * fVar193 + auVar82._4_4_ * fVar215 + fVar212 * auVar8._4_4_;
  auVar271._8_4_ = auVar221._8_4_ * fVar248 + auVar82._8_4_ * fVar250 + fVar252 * auVar8._8_4_;
  auVar271._12_4_ = auVar221._12_4_ * fVar210 + auVar82._12_4_ * fVar211 + fVar213 * auVar8._12_4_;
  local_430 = vsubps_avx(_local_510,auVar156);
  auVar156 = vshufps_avx(local_430,local_430,0xaa);
  auVar82 = vmovshdup_avx(local_430);
  auVar221 = vmovsldup_avx(local_430);
  auVar107._0_4_ = fVar235 * auVar221._0_4_ + fVar249 * auVar82._0_4_ + fVar251 * auVar156._0_4_;
  auVar107._4_4_ = fVar193 * auVar221._4_4_ + fVar215 * auVar82._4_4_ + fVar212 * auVar156._4_4_;
  auVar107._8_4_ = fVar248 * auVar221._8_4_ + fVar250 * auVar82._8_4_ + fVar252 * auVar156._8_4_;
  auVar107._12_4_ = fVar210 * auVar221._12_4_ + fVar211 * auVar82._12_4_ + fVar213 * auVar156._12_4_
  ;
  auVar8 = vmovlhps_avx(_local_720,auVar283);
  auVar293 = vmovlhps_avx(_local_6d0,auVar258);
  auVar9 = vmovlhps_avx(auVar322,auVar271);
  _local_3a0 = vmovlhps_avx(auVar314,auVar107);
  auVar82 = vminps_avx(auVar8,auVar293);
  auVar221 = vminps_avx(auVar9,_local_3a0);
  auVar156 = vminps_avx(auVar82,auVar221);
  auVar82 = vmaxps_avx(auVar8,auVar293);
  auVar221 = vmaxps_avx(auVar9,_local_3a0);
  auVar82 = vmaxps_avx(auVar82,auVar221);
  auVar221 = vshufpd_avx(auVar156,auVar156,3);
  auVar156 = vminps_avx(auVar156,auVar221);
  auVar221 = vshufpd_avx(auVar82,auVar82,3);
  auVar221 = vmaxps_avx(auVar82,auVar221);
  auVar223._8_4_ = 0x7fffffff;
  auVar223._0_8_ = 0x7fffffff7fffffff;
  auVar223._12_4_ = 0x7fffffff;
  auVar82 = vandps_avx(auVar156,auVar223);
  auVar221 = vandps_avx(auVar221,auVar223);
  auVar82 = vmaxps_avx(auVar82,auVar221);
  auVar221 = vmovshdup_avx(auVar82);
  auVar82 = vmaxss_avx(auVar221,auVar82);
  fVar235 = auVar82._0_4_ * 9.536743e-07;
  local_3b0 = ZEXT416((uint)fVar235);
  auVar82 = vshufps_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),0);
  local_1c0._16_16_ = auVar82;
  local_1c0._0_16_ = auVar82;
  auVar78._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
  auVar78._8_4_ = auVar82._8_4_ ^ 0x80000000;
  auVar78._12_4_ = auVar82._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar78;
  local_1e0._0_16_ = auVar78;
  auVar82 = vpshufd_avx(ZEXT416(uVar68),0);
  local_320._16_16_ = auVar82;
  local_320._0_16_ = auVar82;
  auVar82 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar70 * 4 + 6)),0);
  local_340._16_16_ = auVar82;
  local_340._0_16_ = auVar82;
  bVar75 = false;
  uVar73 = 0;
  fVar235 = *(float *)(ray + k * 4 + 0x60);
  _local_370 = vsubps_avx(auVar293,auVar8);
  _local_380 = vsubps_avx(auVar9,auVar293);
  _local_390 = vsubps_avx(_local_3a0,auVar9);
  _local_460 = vsubps_avx(_local_4f0,_local_4e0);
  _local_470 = vsubps_avx(_local_540,_local_520);
  _local_480 = vsubps_avx(_local_450,_local_530);
  _local_490 = vsubps_avx(_local_510,_local_500);
  auVar329 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar337 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_0099e98c:
  local_440 = auVar337._0_16_;
  auVar104 = auVar329._0_16_;
  auVar82 = vshufps_avx(auVar104,auVar104,0x50);
  auVar323._8_4_ = 0x3f800000;
  auVar323._0_8_ = 0x3f8000003f800000;
  auVar323._12_4_ = 0x3f800000;
  auVar328._16_4_ = 0x3f800000;
  auVar328._0_16_ = auVar323;
  auVar328._20_4_ = 0x3f800000;
  auVar328._24_4_ = 0x3f800000;
  auVar328._28_4_ = 0x3f800000;
  auVar221 = vsubps_avx(auVar323,auVar82);
  fVar193 = auVar82._0_4_;
  fVar248 = auVar82._4_4_;
  fVar210 = auVar82._8_4_;
  fVar249 = auVar82._12_4_;
  fVar215 = auVar221._0_4_;
  fVar250 = auVar221._4_4_;
  fVar211 = auVar221._8_4_;
  fVar251 = auVar221._12_4_;
  auVar167._0_4_ = auVar283._0_4_ * fVar193 + fVar215 * fVar253;
  auVar167._4_4_ = auVar283._4_4_ * fVar248 + fVar250 * fVar216;
  auVar167._8_4_ = auVar283._0_4_ * fVar210 + fVar211 * fVar253;
  auVar167._12_4_ = auVar283._4_4_ * fVar249 + fVar251 * fVar216;
  auVar139._0_4_ = auVar258._0_4_ * fVar193 + fVar215 * fVar214;
  auVar139._4_4_ = auVar258._4_4_ * fVar248 + fVar250 * fVar228;
  auVar139._8_4_ = auVar258._0_4_ * fVar210 + fVar211 * fVar214;
  auVar139._12_4_ = auVar258._4_4_ * fVar249 + fVar251 * fVar228;
  auVar241._0_4_ = auVar271._0_4_ * fVar193 + auVar322._0_4_ * fVar215;
  auVar241._4_4_ = auVar271._4_4_ * fVar248 + auVar322._4_4_ * fVar250;
  auVar241._8_4_ = auVar271._0_4_ * fVar210 + auVar322._0_4_ * fVar211;
  auVar241._12_4_ = auVar271._4_4_ * fVar249 + auVar322._4_4_ * fVar251;
  auVar178._0_4_ = auVar107._0_4_ * fVar193 + auVar314._0_4_ * fVar215;
  auVar178._4_4_ = auVar107._4_4_ * fVar248 + auVar314._4_4_ * fVar250;
  auVar178._8_4_ = auVar107._0_4_ * fVar210 + auVar314._0_4_ * fVar211;
  auVar178._12_4_ = auVar107._4_4_ * fVar249 + auVar314._4_4_ * fVar251;
  auVar82 = vmovshdup_avx(local_440);
  auVar221 = vshufps_avx(local_440,local_440,0);
  auVar276._16_16_ = auVar221;
  auVar276._0_16_ = auVar221;
  auVar156 = vshufps_avx(local_440,local_440,0x55);
  auVar97._16_16_ = auVar156;
  auVar97._0_16_ = auVar156;
  auVar93 = vsubps_avx(auVar97,auVar276);
  auVar156 = vshufps_avx(auVar167,auVar167,0);
  auVar122 = vshufps_avx(auVar167,auVar167,0x55);
  auVar110 = vshufps_avx(auVar139,auVar139,0);
  auVar142 = vshufps_avx(auVar139,auVar139,0x55);
  auVar111 = vshufps_avx(auVar241,auVar241,0);
  auVar232 = vshufps_avx(auVar241,auVar241,0x55);
  auVar269 = vshufps_avx(auVar178,auVar178,0);
  auVar77 = vshufps_avx(auVar178,auVar178,0x55);
  auVar82 = ZEXT416((uint)((auVar82._0_4_ - auVar337._0_4_) * 0.04761905));
  auVar82 = vshufps_avx(auVar82,auVar82,0);
  auVar290._0_4_ = auVar221._0_4_ + auVar93._0_4_ * 0.0;
  auVar290._4_4_ = auVar221._4_4_ + auVar93._4_4_ * 0.14285715;
  auVar290._8_4_ = auVar221._8_4_ + auVar93._8_4_ * 0.2857143;
  auVar290._12_4_ = auVar221._12_4_ + auVar93._12_4_ * 0.42857146;
  auVar290._16_4_ = auVar221._0_4_ + auVar93._16_4_ * 0.5714286;
  auVar290._20_4_ = auVar221._4_4_ + auVar93._20_4_ * 0.71428573;
  auVar290._24_4_ = auVar221._8_4_ + auVar93._24_4_ * 0.8571429;
  auVar290._28_4_ = auVar221._12_4_ + auVar93._28_4_;
  auVar19 = vsubps_avx(auVar328,auVar290);
  fVar193 = auVar110._0_4_;
  fVar210 = auVar110._4_4_;
  fVar215 = auVar110._8_4_;
  fVar211 = auVar110._12_4_;
  fVar330 = auVar19._0_4_;
  fVar331 = auVar19._4_4_;
  fVar332 = auVar19._8_4_;
  fVar278 = auVar19._12_4_;
  fVar279 = auVar19._16_4_;
  fVar280 = auVar19._20_4_;
  fVar281 = auVar19._24_4_;
  fVar306 = auVar142._0_4_;
  fVar308 = auVar142._4_4_;
  fVar317 = auVar142._8_4_;
  fVar319 = auVar142._12_4_;
  fVar320 = auVar122._12_4_ + 1.0;
  fVar300 = auVar111._0_4_;
  fVar301 = auVar111._4_4_;
  fVar302 = auVar111._8_4_;
  fVar303 = auVar111._12_4_;
  fVar212 = fVar300 * auVar290._0_4_ + fVar330 * fVar193;
  fVar252 = fVar301 * auVar290._4_4_ + fVar331 * fVar210;
  fVar213 = fVar302 * auVar290._8_4_ + fVar332 * fVar215;
  fVar229 = fVar303 * auVar290._12_4_ + fVar278 * fVar211;
  fVar230 = fVar300 * auVar290._16_4_ + fVar279 * fVar193;
  fVar231 = fVar301 * auVar290._20_4_ + fVar280 * fVar210;
  fVar233 = fVar302 * auVar290._24_4_ + fVar281 * fVar215;
  fVar248 = auVar232._0_4_;
  fVar249 = auVar232._4_4_;
  fVar250 = auVar232._8_4_;
  fVar251 = auVar232._12_4_;
  fVar307 = fVar306 * fVar330 + auVar290._0_4_ * fVar248;
  fVar313 = fVar308 * fVar331 + auVar290._4_4_ * fVar249;
  fVar318 = fVar317 * fVar332 + auVar290._8_4_ * fVar250;
  fVar321 = fVar319 * fVar278 + auVar290._12_4_ * fVar251;
  fVar309 = fVar306 * fVar279 + auVar290._16_4_ * fVar248;
  fVar310 = fVar308 * fVar280 + auVar290._20_4_ * fVar249;
  fVar311 = fVar317 * fVar281 + auVar290._24_4_ * fVar250;
  fVar312 = fVar319 + fVar211;
  auVar221 = vshufps_avx(auVar167,auVar167,0xaa);
  auVar110 = vshufps_avx(auVar167,auVar167,0xff);
  fVar234 = fVar303 + 0.0;
  auVar142 = vshufps_avx(auVar139,auVar139,0xaa);
  auVar111 = vshufps_avx(auVar139,auVar139,0xff);
  auVar191._0_4_ =
       fVar330 * (auVar290._0_4_ * fVar193 + fVar330 * auVar156._0_4_) + auVar290._0_4_ * fVar212;
  auVar191._4_4_ =
       fVar331 * (auVar290._4_4_ * fVar210 + fVar331 * auVar156._4_4_) + auVar290._4_4_ * fVar252;
  auVar191._8_4_ =
       fVar332 * (auVar290._8_4_ * fVar215 + fVar332 * auVar156._8_4_) + auVar290._8_4_ * fVar213;
  auVar191._12_4_ =
       fVar278 * (auVar290._12_4_ * fVar211 + fVar278 * auVar156._12_4_) + auVar290._12_4_ * fVar229
  ;
  auVar191._16_4_ =
       fVar279 * (auVar290._16_4_ * fVar193 + fVar279 * auVar156._0_4_) + auVar290._16_4_ * fVar230;
  auVar191._20_4_ =
       fVar280 * (auVar290._20_4_ * fVar210 + fVar280 * auVar156._4_4_) + auVar290._20_4_ * fVar231;
  auVar191._24_4_ =
       fVar281 * (auVar290._24_4_ * fVar215 + fVar281 * auVar156._8_4_) + auVar290._24_4_ * fVar233;
  auVar191._28_4_ = auVar156._12_4_ + 1.0 + fVar251;
  auVar208._0_4_ =
       fVar330 * (fVar306 * auVar290._0_4_ + auVar122._0_4_ * fVar330) + auVar290._0_4_ * fVar307;
  auVar208._4_4_ =
       fVar331 * (fVar308 * auVar290._4_4_ + auVar122._4_4_ * fVar331) + auVar290._4_4_ * fVar313;
  auVar208._8_4_ =
       fVar332 * (fVar317 * auVar290._8_4_ + auVar122._8_4_ * fVar332) + auVar290._8_4_ * fVar318;
  auVar208._12_4_ =
       fVar278 * (fVar319 * auVar290._12_4_ + auVar122._12_4_ * fVar278) + auVar290._12_4_ * fVar321
  ;
  auVar208._16_4_ =
       fVar279 * (fVar306 * auVar290._16_4_ + auVar122._0_4_ * fVar279) + auVar290._16_4_ * fVar309;
  auVar208._20_4_ =
       fVar280 * (fVar308 * auVar290._20_4_ + auVar122._4_4_ * fVar280) + auVar290._20_4_ * fVar310;
  auVar208._24_4_ =
       fVar281 * (fVar317 * auVar290._24_4_ + auVar122._8_4_ * fVar281) + auVar290._24_4_ * fVar311;
  auVar208._28_4_ = auVar77._12_4_ + fVar251;
  auVar98._0_4_ =
       fVar330 * fVar212 + auVar290._0_4_ * (fVar300 * fVar330 + auVar269._0_4_ * auVar290._0_4_);
  auVar98._4_4_ =
       fVar331 * fVar252 + auVar290._4_4_ * (fVar301 * fVar331 + auVar269._4_4_ * auVar290._4_4_);
  auVar98._8_4_ =
       fVar332 * fVar213 + auVar290._8_4_ * (fVar302 * fVar332 + auVar269._8_4_ * auVar290._8_4_);
  auVar98._12_4_ =
       fVar278 * fVar229 + auVar290._12_4_ * (fVar303 * fVar278 + auVar269._12_4_ * auVar290._12_4_)
  ;
  auVar98._16_4_ =
       fVar279 * fVar230 + auVar290._16_4_ * (fVar300 * fVar279 + auVar269._0_4_ * auVar290._16_4_);
  auVar98._20_4_ =
       fVar280 * fVar231 + auVar290._20_4_ * (fVar301 * fVar280 + auVar269._4_4_ * auVar290._20_4_);
  auVar98._24_4_ =
       fVar281 * fVar233 + auVar290._24_4_ * (fVar302 * fVar281 + auVar269._8_4_ * auVar290._24_4_);
  auVar98._28_4_ = fVar211 + 1.0 + fVar234;
  auVar299._0_4_ =
       fVar330 * fVar307 + auVar290._0_4_ * (auVar77._0_4_ * auVar290._0_4_ + fVar330 * fVar248);
  auVar299._4_4_ =
       fVar331 * fVar313 + auVar290._4_4_ * (auVar77._4_4_ * auVar290._4_4_ + fVar331 * fVar249);
  auVar299._8_4_ =
       fVar332 * fVar318 + auVar290._8_4_ * (auVar77._8_4_ * auVar290._8_4_ + fVar332 * fVar250);
  auVar299._12_4_ =
       fVar278 * fVar321 + auVar290._12_4_ * (auVar77._12_4_ * auVar290._12_4_ + fVar278 * fVar251);
  auVar299._16_4_ =
       fVar279 * fVar309 + auVar290._16_4_ * (auVar77._0_4_ * auVar290._16_4_ + fVar279 * fVar248);
  auVar299._20_4_ =
       fVar280 * fVar310 + auVar290._20_4_ * (auVar77._4_4_ * auVar290._20_4_ + fVar280 * fVar249);
  auVar299._24_4_ =
       fVar281 * fVar311 + auVar290._24_4_ * (auVar77._8_4_ * auVar290._24_4_ + fVar281 * fVar250);
  auVar299._28_4_ = fVar234 + fVar251 + 0.0;
  local_220._0_4_ = fVar330 * auVar191._0_4_ + auVar290._0_4_ * auVar98._0_4_;
  local_220._4_4_ = fVar331 * auVar191._4_4_ + auVar290._4_4_ * auVar98._4_4_;
  local_220._8_4_ = fVar332 * auVar191._8_4_ + auVar290._8_4_ * auVar98._8_4_;
  local_220._12_4_ = fVar278 * auVar191._12_4_ + auVar290._12_4_ * auVar98._12_4_;
  local_220._16_4_ = fVar279 * auVar191._16_4_ + auVar290._16_4_ * auVar98._16_4_;
  local_220._20_4_ = fVar280 * auVar191._20_4_ + auVar290._20_4_ * auVar98._20_4_;
  local_220._24_4_ = fVar281 * auVar191._24_4_ + auVar290._24_4_ * auVar98._24_4_;
  local_220._28_4_ = fVar312 + fVar251 + 0.0;
  auVar175._0_4_ = fVar330 * auVar208._0_4_ + auVar290._0_4_ * auVar299._0_4_;
  auVar175._4_4_ = fVar331 * auVar208._4_4_ + auVar290._4_4_ * auVar299._4_4_;
  auVar175._8_4_ = fVar332 * auVar208._8_4_ + auVar290._8_4_ * auVar299._8_4_;
  auVar175._12_4_ = fVar278 * auVar208._12_4_ + auVar290._12_4_ * auVar299._12_4_;
  auVar175._16_4_ = fVar279 * auVar208._16_4_ + auVar290._16_4_ * auVar299._16_4_;
  auVar175._20_4_ = fVar280 * auVar208._20_4_ + auVar290._20_4_ * auVar299._20_4_;
  auVar175._24_4_ = fVar281 * auVar208._24_4_ + auVar290._24_4_ * auVar299._24_4_;
  auVar175._28_4_ = fVar312 + fVar234;
  auVar20 = vsubps_avx(auVar98,auVar191);
  auVar93 = vsubps_avx(auVar299,auVar208);
  local_660 = auVar82._0_4_;
  fStack_65c = auVar82._4_4_;
  fStack_658 = auVar82._8_4_;
  fStack_654 = auVar82._12_4_;
  local_260 = local_660 * auVar20._0_4_ * 3.0;
  fStack_25c = fStack_65c * auVar20._4_4_ * 3.0;
  auVar27._4_4_ = fStack_25c;
  auVar27._0_4_ = local_260;
  fStack_258 = fStack_658 * auVar20._8_4_ * 3.0;
  auVar27._8_4_ = fStack_258;
  fStack_254 = fStack_654 * auVar20._12_4_ * 3.0;
  auVar27._12_4_ = fStack_254;
  fStack_250 = local_660 * auVar20._16_4_ * 3.0;
  auVar27._16_4_ = fStack_250;
  fStack_24c = fStack_65c * auVar20._20_4_ * 3.0;
  auVar27._20_4_ = fStack_24c;
  fStack_248 = fStack_658 * auVar20._24_4_ * 3.0;
  auVar27._24_4_ = fStack_248;
  auVar27._28_4_ = auVar20._28_4_;
  local_280 = local_660 * auVar93._0_4_ * 3.0;
  fStack_27c = fStack_65c * auVar93._4_4_ * 3.0;
  auVar28._4_4_ = fStack_27c;
  auVar28._0_4_ = local_280;
  fStack_278 = fStack_658 * auVar93._8_4_ * 3.0;
  auVar28._8_4_ = fStack_278;
  fStack_274 = fStack_654 * auVar93._12_4_ * 3.0;
  auVar28._12_4_ = fStack_274;
  fStack_270 = local_660 * auVar93._16_4_ * 3.0;
  auVar28._16_4_ = fStack_270;
  fStack_26c = fStack_65c * auVar93._20_4_ * 3.0;
  auVar28._20_4_ = fStack_26c;
  fStack_268 = fStack_658 * auVar93._24_4_ * 3.0;
  auVar28._24_4_ = fStack_268;
  auVar28._28_4_ = fVar312;
  auVar17 = vsubps_avx(local_220,auVar27);
  auVar93 = vperm2f128_avx(auVar17,auVar17,1);
  auVar93 = vshufps_avx(auVar93,auVar17,0x30);
  auVar93 = vshufps_avx(auVar17,auVar93,0x29);
  auVar18 = vsubps_avx(auVar175,auVar28);
  auVar17 = vperm2f128_avx(auVar18,auVar18,1);
  auVar17 = vshufps_avx(auVar17,auVar18,0x30);
  auVar18 = vshufps_avx(auVar18,auVar17,0x29);
  fVar310 = auVar142._0_4_;
  fVar311 = auVar142._4_4_;
  fVar338 = auVar142._8_4_;
  fVar211 = auVar221._12_4_;
  fVar301 = auVar111._0_4_;
  fVar303 = auVar111._4_4_;
  fVar307 = auVar111._8_4_;
  fVar313 = auVar111._12_4_;
  auVar82 = vshufps_avx(auVar241,auVar241,0xaa);
  fVar193 = auVar82._0_4_;
  fVar210 = auVar82._4_4_;
  fVar215 = auVar82._8_4_;
  fVar251 = auVar82._12_4_;
  fVar213 = auVar290._0_4_ * fVar193 + fVar310 * fVar330;
  fVar229 = auVar290._4_4_ * fVar210 + fVar311 * fVar331;
  fVar230 = auVar290._8_4_ * fVar215 + fVar338 * fVar332;
  fVar231 = auVar290._12_4_ * fVar251 + auVar142._12_4_ * fVar278;
  fVar233 = auVar290._16_4_ * fVar193 + fVar310 * fVar279;
  fVar234 = auVar290._20_4_ * fVar210 + fVar311 * fVar280;
  fVar300 = auVar290._24_4_ * fVar215 + fVar338 * fVar281;
  auVar82 = vshufps_avx(auVar241,auVar241,0xff);
  fVar248 = auVar82._0_4_;
  fVar249 = auVar82._4_4_;
  fVar250 = auVar82._8_4_;
  fVar212 = auVar82._12_4_;
  fVar302 = auVar290._0_4_ * fVar248 + fVar301 * fVar330;
  fVar306 = auVar290._4_4_ * fVar249 + fVar303 * fVar331;
  fVar308 = auVar290._8_4_ * fVar250 + fVar307 * fVar332;
  fVar317 = auVar290._12_4_ * fVar212 + fVar313 * fVar278;
  fVar318 = auVar290._16_4_ * fVar248 + fVar301 * fVar279;
  fVar319 = auVar290._20_4_ * fVar249 + fVar303 * fVar280;
  fVar321 = auVar290._24_4_ * fVar250 + fVar307 * fVar281;
  auVar82 = vshufps_avx(auVar178,auVar178,0xaa);
  fVar309 = auVar82._12_4_ + fVar251;
  auVar156 = vshufps_avx(auVar178,auVar178,0xff);
  fVar252 = auVar156._12_4_;
  auVar99._0_4_ =
       fVar330 * (fVar310 * auVar290._0_4_ + fVar330 * auVar221._0_4_) + auVar290._0_4_ * fVar213;
  auVar99._4_4_ =
       fVar331 * (fVar311 * auVar290._4_4_ + fVar331 * auVar221._4_4_) + auVar290._4_4_ * fVar229;
  auVar99._8_4_ =
       fVar332 * (fVar338 * auVar290._8_4_ + fVar332 * auVar221._8_4_) + auVar290._8_4_ * fVar230;
  auVar99._12_4_ =
       fVar278 * (auVar142._12_4_ * auVar290._12_4_ + fVar278 * fVar211) + auVar290._12_4_ * fVar231
  ;
  auVar99._16_4_ =
       fVar279 * (fVar310 * auVar290._16_4_ + fVar279 * auVar221._0_4_) + auVar290._16_4_ * fVar233;
  auVar99._20_4_ =
       fVar280 * (fVar311 * auVar290._20_4_ + fVar280 * auVar221._4_4_) + auVar290._20_4_ * fVar234;
  auVar99._24_4_ =
       fVar281 * (fVar338 * auVar290._24_4_ + fVar281 * auVar221._8_4_) + auVar290._24_4_ * fVar300;
  auVar99._28_4_ = auVar18._28_4_ + fVar211 + fVar252;
  auVar131._0_4_ =
       fVar330 * (fVar301 * auVar290._0_4_ + auVar110._0_4_ * fVar330) + auVar290._0_4_ * fVar302;
  auVar131._4_4_ =
       fVar331 * (fVar303 * auVar290._4_4_ + auVar110._4_4_ * fVar331) + auVar290._4_4_ * fVar306;
  auVar131._8_4_ =
       fVar332 * (fVar307 * auVar290._8_4_ + auVar110._8_4_ * fVar332) + auVar290._8_4_ * fVar308;
  auVar131._12_4_ =
       fVar278 * (fVar313 * auVar290._12_4_ + auVar110._12_4_ * fVar278) + auVar290._12_4_ * fVar317
  ;
  auVar131._16_4_ =
       fVar279 * (fVar301 * auVar290._16_4_ + auVar110._0_4_ * fVar279) + auVar290._16_4_ * fVar318;
  auVar131._20_4_ =
       fVar280 * (fVar303 * auVar290._20_4_ + auVar110._4_4_ * fVar280) + auVar290._20_4_ * fVar319;
  auVar131._24_4_ =
       fVar281 * (fVar307 * auVar290._24_4_ + auVar110._8_4_ * fVar281) + auVar290._24_4_ * fVar321;
  auVar131._28_4_ = fVar211 + auVar17._28_4_ + fVar252;
  auVar17 = vperm2f128_avx(local_220,local_220,1);
  auVar17 = vshufps_avx(auVar17,local_220,0x30);
  _local_560 = vshufps_avx(local_220,auVar17,0x29);
  auVar209._0_4_ =
       auVar290._0_4_ * (auVar82._0_4_ * auVar290._0_4_ + fVar330 * fVar193) + fVar330 * fVar213;
  auVar209._4_4_ =
       auVar290._4_4_ * (auVar82._4_4_ * auVar290._4_4_ + fVar331 * fVar210) + fVar331 * fVar229;
  auVar209._8_4_ =
       auVar290._8_4_ * (auVar82._8_4_ * auVar290._8_4_ + fVar332 * fVar215) + fVar332 * fVar230;
  auVar209._12_4_ =
       auVar290._12_4_ * (auVar82._12_4_ * auVar290._12_4_ + fVar278 * fVar251) + fVar278 * fVar231;
  auVar209._16_4_ =
       auVar290._16_4_ * (auVar82._0_4_ * auVar290._16_4_ + fVar279 * fVar193) + fVar279 * fVar233;
  auVar209._20_4_ =
       auVar290._20_4_ * (auVar82._4_4_ * auVar290._20_4_ + fVar280 * fVar210) + fVar280 * fVar234;
  auVar209._24_4_ =
       auVar290._24_4_ * (auVar82._8_4_ * auVar290._24_4_ + fVar281 * fVar215) + fVar281 * fVar300;
  auVar209._28_4_ = fVar309 + fVar320 + auVar208._28_4_;
  auVar264._0_4_ =
       fVar330 * fVar302 + auVar290._0_4_ * (auVar290._0_4_ * auVar156._0_4_ + fVar330 * fVar248);
  auVar264._4_4_ =
       fVar331 * fVar306 + auVar290._4_4_ * (auVar290._4_4_ * auVar156._4_4_ + fVar331 * fVar249);
  auVar264._8_4_ =
       fVar332 * fVar308 + auVar290._8_4_ * (auVar290._8_4_ * auVar156._8_4_ + fVar332 * fVar250);
  auVar264._12_4_ =
       fVar278 * fVar317 + auVar290._12_4_ * (auVar290._12_4_ * fVar252 + fVar278 * fVar212);
  auVar264._16_4_ =
       fVar279 * fVar318 + auVar290._16_4_ * (auVar290._16_4_ * auVar156._0_4_ + fVar279 * fVar248);
  auVar264._20_4_ =
       fVar280 * fVar319 + auVar290._20_4_ * (auVar290._20_4_ * auVar156._4_4_ + fVar280 * fVar249);
  auVar264._24_4_ =
       fVar281 * fVar321 + auVar290._24_4_ * (auVar290._24_4_ * auVar156._8_4_ + fVar281 * fVar250);
  auVar264._28_4_ = fVar320 + fVar313 + fVar252 + fVar212;
  auVar247._0_4_ = fVar330 * auVar99._0_4_ + auVar290._0_4_ * auVar209._0_4_;
  auVar247._4_4_ = fVar331 * auVar99._4_4_ + auVar290._4_4_ * auVar209._4_4_;
  auVar247._8_4_ = fVar332 * auVar99._8_4_ + auVar290._8_4_ * auVar209._8_4_;
  auVar247._12_4_ = fVar278 * auVar99._12_4_ + auVar290._12_4_ * auVar209._12_4_;
  auVar247._16_4_ = fVar279 * auVar99._16_4_ + auVar290._16_4_ * auVar209._16_4_;
  auVar247._20_4_ = fVar280 * auVar99._20_4_ + auVar290._20_4_ * auVar209._20_4_;
  auVar247._24_4_ = fVar281 * auVar99._24_4_ + auVar290._24_4_ * auVar209._24_4_;
  auVar247._28_4_ = fVar309 + fVar252 + fVar212;
  auVar277._0_4_ = fVar330 * auVar131._0_4_ + auVar290._0_4_ * auVar264._0_4_;
  auVar277._4_4_ = fVar331 * auVar131._4_4_ + auVar290._4_4_ * auVar264._4_4_;
  auVar277._8_4_ = fVar332 * auVar131._8_4_ + auVar290._8_4_ * auVar264._8_4_;
  auVar277._12_4_ = fVar278 * auVar131._12_4_ + auVar290._12_4_ * auVar264._12_4_;
  auVar277._16_4_ = fVar279 * auVar131._16_4_ + auVar290._16_4_ * auVar264._16_4_;
  auVar277._20_4_ = fVar280 * auVar131._20_4_ + auVar290._20_4_ * auVar264._20_4_;
  auVar277._24_4_ = fVar281 * auVar131._24_4_ + auVar290._24_4_ * auVar264._24_4_;
  auVar277._28_4_ = auVar19._28_4_ + auVar290._28_4_;
  auVar23 = vsubps_avx(auVar209,auVar99);
  auVar17 = vsubps_avx(auVar264,auVar131);
  local_2a0 = local_660 * auVar23._0_4_ * 3.0;
  fStack_29c = fStack_65c * auVar23._4_4_ * 3.0;
  auVar29._4_4_ = fStack_29c;
  auVar29._0_4_ = local_2a0;
  fStack_298 = fStack_658 * auVar23._8_4_ * 3.0;
  auVar29._8_4_ = fStack_298;
  fStack_294 = fStack_654 * auVar23._12_4_ * 3.0;
  auVar29._12_4_ = fStack_294;
  fStack_290 = local_660 * auVar23._16_4_ * 3.0;
  auVar29._16_4_ = fStack_290;
  fStack_28c = fStack_65c * auVar23._20_4_ * 3.0;
  auVar29._20_4_ = fStack_28c;
  fStack_288 = fStack_658 * auVar23._24_4_ * 3.0;
  auVar29._24_4_ = fStack_288;
  auVar29._28_4_ = auVar23._28_4_;
  local_2c0 = local_660 * auVar17._0_4_ * 3.0;
  fStack_2bc = fStack_65c * auVar17._4_4_ * 3.0;
  auVar30._4_4_ = fStack_2bc;
  auVar30._0_4_ = local_2c0;
  fStack_2b8 = fStack_658 * auVar17._8_4_ * 3.0;
  auVar30._8_4_ = fStack_2b8;
  fStack_2b4 = fStack_654 * auVar17._12_4_ * 3.0;
  auVar30._12_4_ = fStack_2b4;
  fStack_2b0 = local_660 * auVar17._16_4_ * 3.0;
  auVar30._16_4_ = fStack_2b0;
  fStack_2ac = fStack_65c * auVar17._20_4_ * 3.0;
  auVar30._20_4_ = fStack_2ac;
  fStack_2a8 = fStack_658 * auVar17._24_4_ * 3.0;
  auVar30._24_4_ = fStack_2a8;
  auVar30._28_4_ = auVar209._28_4_;
  auVar17 = vperm2f128_avx(auVar247,auVar247,1);
  auVar17 = vshufps_avx(auVar17,auVar247,0x30);
  auVar21 = vshufps_avx(auVar247,auVar17,0x29);
  auVar19 = vsubps_avx(auVar247,auVar29);
  auVar17 = vperm2f128_avx(auVar19,auVar19,1);
  auVar17 = vshufps_avx(auVar17,auVar19,0x30);
  auVar17 = vshufps_avx(auVar19,auVar17,0x29);
  auVar22 = vsubps_avx(auVar277,auVar30);
  auVar19 = vperm2f128_avx(auVar22,auVar22,1);
  auVar19 = vshufps_avx(auVar19,auVar22,0x30);
  local_200 = vshufps_avx(auVar22,auVar19,0x29);
  auVar24 = vsubps_avx(auVar247,local_220);
  auVar25 = vsubps_avx(auVar21,_local_560);
  fVar193 = auVar25._0_4_ + auVar24._0_4_;
  fVar248 = auVar25._4_4_ + auVar24._4_4_;
  fVar210 = auVar25._8_4_ + auVar24._8_4_;
  fVar249 = auVar25._12_4_ + auVar24._12_4_;
  fVar215 = auVar25._16_4_ + auVar24._16_4_;
  fVar250 = auVar25._20_4_ + auVar24._20_4_;
  fVar211 = auVar25._24_4_ + auVar24._24_4_;
  auVar19 = vperm2f128_avx(auVar175,auVar175,1);
  auVar19 = vshufps_avx(auVar19,auVar175,0x30);
  local_240 = vshufps_avx(auVar175,auVar19,0x29);
  auVar19 = vperm2f128_avx(auVar277,auVar277,1);
  auVar19 = vshufps_avx(auVar19,auVar277,0x30);
  auVar22 = vshufps_avx(auVar277,auVar19,0x29);
  auVar19 = vsubps_avx(auVar277,auVar175);
  auVar26 = vsubps_avx(auVar22,local_240);
  fVar251 = auVar26._0_4_ + auVar19._0_4_;
  fVar212 = auVar26._4_4_ + auVar19._4_4_;
  fVar252 = auVar26._8_4_ + auVar19._8_4_;
  fVar213 = auVar26._12_4_ + auVar19._12_4_;
  fVar229 = auVar26._16_4_ + auVar19._16_4_;
  fVar230 = auVar26._20_4_ + auVar19._20_4_;
  fVar231 = auVar26._24_4_ + auVar19._24_4_;
  auVar31._4_4_ = fVar248 * auVar175._4_4_;
  auVar31._0_4_ = fVar193 * auVar175._0_4_;
  auVar31._8_4_ = fVar210 * auVar175._8_4_;
  auVar31._12_4_ = fVar249 * auVar175._12_4_;
  auVar31._16_4_ = fVar215 * auVar175._16_4_;
  auVar31._20_4_ = fVar250 * auVar175._20_4_;
  auVar31._24_4_ = fVar211 * auVar175._24_4_;
  auVar31._28_4_ = auVar19._28_4_;
  auVar32._4_4_ = fVar212 * local_220._4_4_;
  auVar32._0_4_ = fVar251 * local_220._0_4_;
  auVar32._8_4_ = fVar252 * local_220._8_4_;
  auVar32._12_4_ = fVar213 * local_220._12_4_;
  auVar32._16_4_ = fVar229 * local_220._16_4_;
  auVar32._20_4_ = fVar230 * local_220._20_4_;
  auVar32._24_4_ = fVar231 * local_220._24_4_;
  auVar32._28_4_ = fVar309;
  auVar94 = vsubps_avx(auVar31,auVar32);
  local_260 = local_220._0_4_ + local_260;
  fStack_25c = local_220._4_4_ + fStack_25c;
  fStack_258 = local_220._8_4_ + fStack_258;
  fStack_254 = local_220._12_4_ + fStack_254;
  fStack_250 = local_220._16_4_ + fStack_250;
  fStack_24c = local_220._20_4_ + fStack_24c;
  fStack_248 = local_220._24_4_ + fStack_248;
  fStack_244 = local_220._28_4_ + auVar20._28_4_;
  local_280 = local_280 + auVar175._0_4_;
  fStack_27c = fStack_27c + auVar175._4_4_;
  fStack_278 = fStack_278 + auVar175._8_4_;
  fStack_274 = fStack_274 + auVar175._12_4_;
  fStack_270 = fStack_270 + auVar175._16_4_;
  fStack_26c = fStack_26c + auVar175._20_4_;
  fStack_268 = fStack_268 + auVar175._24_4_;
  fStack_264 = fVar312 + auVar175._28_4_;
  auVar33._4_4_ = fVar248 * fStack_27c;
  auVar33._0_4_ = fVar193 * local_280;
  auVar33._8_4_ = fVar210 * fStack_278;
  auVar33._12_4_ = fVar249 * fStack_274;
  auVar33._16_4_ = fVar215 * fStack_270;
  auVar33._20_4_ = fVar250 * fStack_26c;
  auVar33._24_4_ = fVar211 * fStack_268;
  auVar33._28_4_ = fVar312;
  auVar34._4_4_ = fVar212 * fStack_25c;
  auVar34._0_4_ = fVar251 * local_260;
  auVar34._8_4_ = fVar252 * fStack_258;
  auVar34._12_4_ = fVar213 * fStack_254;
  auVar34._16_4_ = fVar229 * fStack_250;
  auVar34._20_4_ = fVar230 * fStack_24c;
  auVar34._24_4_ = fVar231 * fStack_248;
  auVar34._28_4_ = fVar312 + auVar175._28_4_;
  auVar20 = vsubps_avx(auVar33,auVar34);
  local_6a0 = auVar18._0_4_;
  fStack_69c = auVar18._4_4_;
  fStack_698 = auVar18._8_4_;
  fStack_694 = auVar18._12_4_;
  fStack_690 = auVar18._16_4_;
  fStack_68c = auVar18._20_4_;
  fStack_688 = auVar18._24_4_;
  auVar35._4_4_ = fVar248 * fStack_69c;
  auVar35._0_4_ = fVar193 * local_6a0;
  auVar35._8_4_ = fVar210 * fStack_698;
  auVar35._12_4_ = fVar249 * fStack_694;
  auVar35._16_4_ = fVar215 * fStack_690;
  auVar35._20_4_ = fVar250 * fStack_68c;
  auVar35._24_4_ = fVar211 * fStack_688;
  auVar35._28_4_ = fVar312;
  local_720._0_4_ = auVar93._0_4_;
  local_720._4_4_ = auVar93._4_4_;
  fStack_718 = auVar93._8_4_;
  fStack_714 = auVar93._12_4_;
  fStack_710 = auVar93._16_4_;
  fStack_70c = auVar93._20_4_;
  fStack_708 = auVar93._24_4_;
  auVar36._4_4_ = fVar212 * (float)local_720._4_4_;
  auVar36._0_4_ = fVar251 * (float)local_720._0_4_;
  auVar36._8_4_ = fVar252 * fStack_718;
  auVar36._12_4_ = fVar213 * fStack_714;
  auVar36._16_4_ = fVar229 * fStack_710;
  auVar36._20_4_ = fVar230 * fStack_70c;
  auVar36._24_4_ = fVar231 * fStack_708;
  auVar36._28_4_ = local_220._28_4_;
  auVar95 = vsubps_avx(auVar35,auVar36);
  auVar37._4_4_ = local_240._4_4_ * fVar248;
  auVar37._0_4_ = local_240._0_4_ * fVar193;
  auVar37._8_4_ = local_240._8_4_ * fVar210;
  auVar37._12_4_ = local_240._12_4_ * fVar249;
  auVar37._16_4_ = local_240._16_4_ * fVar215;
  auVar37._20_4_ = local_240._20_4_ * fVar250;
  auVar37._24_4_ = local_240._24_4_ * fVar211;
  auVar37._28_4_ = fVar312;
  auVar38._4_4_ = local_560._4_4_ * fVar212;
  auVar38._0_4_ = local_560._0_4_ * fVar251;
  auVar38._8_4_ = local_560._8_4_ * fVar252;
  auVar38._12_4_ = local_560._12_4_ * fVar213;
  auVar38._16_4_ = local_560._16_4_ * fVar229;
  auVar38._20_4_ = local_560._20_4_ * fVar230;
  auVar38._24_4_ = local_560._24_4_ * fVar231;
  auVar38._28_4_ = local_240._28_4_;
  local_660 = auVar17._0_4_;
  fStack_65c = auVar17._4_4_;
  fStack_658 = auVar17._8_4_;
  fStack_654 = auVar17._12_4_;
  fStack_650 = auVar17._16_4_;
  fStack_64c = auVar17._20_4_;
  fStack_648 = auVar17._24_4_;
  auVar96 = vsubps_avx(auVar37,auVar38);
  auVar39._4_4_ = auVar277._4_4_ * fVar248;
  auVar39._0_4_ = auVar277._0_4_ * fVar193;
  auVar39._8_4_ = auVar277._8_4_ * fVar210;
  auVar39._12_4_ = auVar277._12_4_ * fVar249;
  auVar39._16_4_ = auVar277._16_4_ * fVar215;
  auVar39._20_4_ = auVar277._20_4_ * fVar250;
  auVar39._24_4_ = auVar277._24_4_ * fVar211;
  auVar39._28_4_ = fVar312;
  auVar40._4_4_ = fVar212 * auVar247._4_4_;
  auVar40._0_4_ = fVar251 * auVar247._0_4_;
  auVar40._8_4_ = fVar252 * auVar247._8_4_;
  auVar40._12_4_ = fVar213 * auVar247._12_4_;
  auVar40._16_4_ = fVar229 * auVar247._16_4_;
  auVar40._20_4_ = fVar230 * auVar247._20_4_;
  auVar40._24_4_ = fVar231 * auVar247._24_4_;
  auVar40._28_4_ = fStack_244;
  auVar127 = vsubps_avx(auVar39,auVar40);
  local_2a0 = auVar247._0_4_ + local_2a0;
  fStack_29c = auVar247._4_4_ + fStack_29c;
  fStack_298 = auVar247._8_4_ + fStack_298;
  fStack_294 = auVar247._12_4_ + fStack_294;
  fStack_290 = auVar247._16_4_ + fStack_290;
  fStack_28c = auVar247._20_4_ + fStack_28c;
  fStack_288 = auVar247._24_4_ + fStack_288;
  fStack_284 = auVar247._28_4_ + auVar23._28_4_;
  local_2c0 = auVar277._0_4_ + local_2c0;
  fStack_2bc = auVar277._4_4_ + fStack_2bc;
  fStack_2b8 = auVar277._8_4_ + fStack_2b8;
  fStack_2b4 = auVar277._12_4_ + fStack_2b4;
  fStack_2b0 = auVar277._16_4_ + fStack_2b0;
  fStack_2ac = auVar277._20_4_ + fStack_2ac;
  fStack_2a8 = auVar277._24_4_ + fStack_2a8;
  fStack_2a4 = auVar277._28_4_ + auVar209._28_4_;
  auVar41._4_4_ = fVar248 * fStack_2bc;
  auVar41._0_4_ = fVar193 * local_2c0;
  auVar41._8_4_ = fVar210 * fStack_2b8;
  auVar41._12_4_ = fVar249 * fStack_2b4;
  auVar41._16_4_ = fVar215 * fStack_2b0;
  auVar41._20_4_ = fVar250 * fStack_2ac;
  auVar41._24_4_ = fVar211 * fStack_2a8;
  auVar41._28_4_ = auVar277._28_4_ + auVar209._28_4_;
  auVar42._4_4_ = fStack_29c * fVar212;
  auVar42._0_4_ = local_2a0 * fVar251;
  auVar42._8_4_ = fStack_298 * fVar252;
  auVar42._12_4_ = fStack_294 * fVar213;
  auVar42._16_4_ = fStack_290 * fVar229;
  auVar42._20_4_ = fStack_28c * fVar230;
  auVar42._24_4_ = fStack_288 * fVar231;
  auVar42._28_4_ = fStack_284;
  auVar23 = vsubps_avx(auVar41,auVar42);
  auVar43._4_4_ = fVar248 * local_200._4_4_;
  auVar43._0_4_ = fVar193 * local_200._0_4_;
  auVar43._8_4_ = fVar210 * local_200._8_4_;
  auVar43._12_4_ = fVar249 * local_200._12_4_;
  auVar43._16_4_ = fVar215 * local_200._16_4_;
  auVar43._20_4_ = fVar250 * local_200._20_4_;
  auVar43._24_4_ = fVar211 * local_200._24_4_;
  auVar43._28_4_ = fStack_284;
  auVar44._4_4_ = fVar212 * fStack_65c;
  auVar44._0_4_ = fVar251 * local_660;
  auVar44._8_4_ = fVar252 * fStack_658;
  auVar44._12_4_ = fVar213 * fStack_654;
  auVar44._16_4_ = fVar229 * fStack_650;
  auVar44._20_4_ = fVar230 * fStack_64c;
  auVar44._24_4_ = fVar231 * fStack_648;
  auVar44._28_4_ = local_200._28_4_;
  auVar128 = vsubps_avx(auVar43,auVar44);
  auVar45._4_4_ = fVar248 * auVar22._4_4_;
  auVar45._0_4_ = fVar193 * auVar22._0_4_;
  auVar45._8_4_ = fVar210 * auVar22._8_4_;
  auVar45._12_4_ = fVar249 * auVar22._12_4_;
  auVar45._16_4_ = fVar215 * auVar22._16_4_;
  auVar45._20_4_ = fVar250 * auVar22._20_4_;
  auVar45._24_4_ = fVar211 * auVar22._24_4_;
  auVar45._28_4_ = auVar25._28_4_ + auVar24._28_4_;
  auVar46._4_4_ = auVar21._4_4_ * fVar212;
  auVar46._0_4_ = auVar21._0_4_ * fVar251;
  auVar46._8_4_ = auVar21._8_4_ * fVar252;
  auVar46._12_4_ = auVar21._12_4_ * fVar213;
  auVar46._16_4_ = auVar21._16_4_ * fVar229;
  auVar46._20_4_ = auVar21._20_4_ * fVar230;
  auVar46._24_4_ = auVar21._24_4_ * fVar231;
  auVar46._28_4_ = auVar26._28_4_ + auVar19._28_4_;
  auVar24 = vsubps_avx(auVar45,auVar46);
  auVar17 = vminps_avx(auVar94,auVar20);
  auVar93 = vmaxps_avx(auVar94,auVar20);
  auVar18 = vminps_avx(auVar95,auVar96);
  auVar18 = vminps_avx(auVar17,auVar18);
  auVar17 = vmaxps_avx(auVar95,auVar96);
  auVar93 = vmaxps_avx(auVar93,auVar17);
  auVar19 = vminps_avx(auVar127,auVar23);
  auVar17 = vmaxps_avx(auVar127,auVar23);
  auVar20 = vminps_avx(auVar128,auVar24);
  auVar20 = vminps_avx(auVar19,auVar20);
  auVar20 = vminps_avx(auVar18,auVar20);
  auVar18 = vmaxps_avx(auVar128,auVar24);
  auVar17 = vmaxps_avx(auVar17,auVar18);
  auVar17 = vmaxps_avx(auVar93,auVar17);
  auVar93 = vcmpps_avx(auVar20,local_1c0,2);
  auVar17 = vcmpps_avx(auVar17,local_1e0,5);
  auVar93 = vandps_avx(auVar17,auVar93);
  auVar17 = local_2e0 & auVar93;
  if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0x7f,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar17 >> 0xbf,0) != '\0') ||
      (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0') {
    auVar17 = vsubps_avx(_local_560,local_220);
    auVar18 = vsubps_avx(auVar21,auVar247);
    fVar248 = auVar17._0_4_ + auVar18._0_4_;
    fVar210 = auVar17._4_4_ + auVar18._4_4_;
    fVar249 = auVar17._8_4_ + auVar18._8_4_;
    fVar215 = auVar17._12_4_ + auVar18._12_4_;
    fVar250 = auVar17._16_4_ + auVar18._16_4_;
    fVar211 = auVar17._20_4_ + auVar18._20_4_;
    fVar251 = auVar17._24_4_ + auVar18._24_4_;
    auVar20 = vsubps_avx(local_240,auVar175);
    auVar23 = vsubps_avx(auVar22,auVar277);
    fVar212 = auVar20._0_4_ + auVar23._0_4_;
    fVar252 = auVar20._4_4_ + auVar23._4_4_;
    fVar213 = auVar20._8_4_ + auVar23._8_4_;
    fVar229 = auVar20._12_4_ + auVar23._12_4_;
    fVar230 = auVar20._16_4_ + auVar23._16_4_;
    fVar231 = auVar20._20_4_ + auVar23._20_4_;
    fVar233 = auVar20._24_4_ + auVar23._24_4_;
    fVar193 = auVar23._28_4_;
    auVar47._4_4_ = auVar175._4_4_ * fVar210;
    auVar47._0_4_ = auVar175._0_4_ * fVar248;
    auVar47._8_4_ = auVar175._8_4_ * fVar249;
    auVar47._12_4_ = auVar175._12_4_ * fVar215;
    auVar47._16_4_ = auVar175._16_4_ * fVar250;
    auVar47._20_4_ = auVar175._20_4_ * fVar211;
    auVar47._24_4_ = auVar175._24_4_ * fVar251;
    auVar47._28_4_ = auVar175._28_4_;
    auVar48._4_4_ = local_220._4_4_ * fVar252;
    auVar48._0_4_ = local_220._0_4_ * fVar212;
    auVar48._8_4_ = local_220._8_4_ * fVar213;
    auVar48._12_4_ = local_220._12_4_ * fVar229;
    auVar48._16_4_ = local_220._16_4_ * fVar230;
    auVar48._20_4_ = local_220._20_4_ * fVar231;
    auVar48._24_4_ = local_220._24_4_ * fVar233;
    auVar48._28_4_ = local_220._28_4_;
    auVar23 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = fVar210 * fStack_27c;
    auVar49._0_4_ = fVar248 * local_280;
    auVar49._8_4_ = fVar249 * fStack_278;
    auVar49._12_4_ = fVar215 * fStack_274;
    auVar49._16_4_ = fVar250 * fStack_270;
    auVar49._20_4_ = fVar211 * fStack_26c;
    auVar49._24_4_ = fVar251 * fStack_268;
    auVar49._28_4_ = auVar175._28_4_;
    auVar50._4_4_ = fVar252 * fStack_25c;
    auVar50._0_4_ = fVar212 * local_260;
    auVar50._8_4_ = fVar213 * fStack_258;
    auVar50._12_4_ = fVar229 * fStack_254;
    auVar50._16_4_ = fVar230 * fStack_250;
    auVar50._20_4_ = fVar231 * fStack_24c;
    auVar50._24_4_ = fVar233 * fStack_248;
    auVar50._28_4_ = fVar193;
    auVar24 = vsubps_avx(auVar49,auVar50);
    auVar51._4_4_ = fVar210 * fStack_69c;
    auVar51._0_4_ = fVar248 * local_6a0;
    auVar51._8_4_ = fVar249 * fStack_698;
    auVar51._12_4_ = fVar215 * fStack_694;
    auVar51._16_4_ = fVar250 * fStack_690;
    auVar51._20_4_ = fVar211 * fStack_68c;
    auVar51._24_4_ = fVar251 * fStack_688;
    auVar51._28_4_ = fVar193;
    auVar52._4_4_ = fVar252 * (float)local_720._4_4_;
    auVar52._0_4_ = fVar212 * (float)local_720._0_4_;
    auVar52._8_4_ = fVar213 * fStack_718;
    auVar52._12_4_ = fVar229 * fStack_714;
    auVar52._16_4_ = fVar230 * fStack_710;
    auVar52._20_4_ = fVar231 * fStack_70c;
    auVar52._24_4_ = fVar233 * fStack_708;
    auVar52._28_4_ = auVar19._28_4_;
    auVar25 = vsubps_avx(auVar51,auVar52);
    auVar53._4_4_ = local_240._4_4_ * fVar210;
    auVar53._0_4_ = local_240._0_4_ * fVar248;
    auVar53._8_4_ = local_240._8_4_ * fVar249;
    auVar53._12_4_ = local_240._12_4_ * fVar215;
    auVar53._16_4_ = local_240._16_4_ * fVar250;
    auVar53._20_4_ = local_240._20_4_ * fVar211;
    auVar53._24_4_ = local_240._24_4_ * fVar251;
    auVar53._28_4_ = auVar19._28_4_;
    auVar54._4_4_ = local_560._4_4_ * fVar252;
    auVar54._0_4_ = local_560._0_4_ * fVar212;
    auVar54._8_4_ = local_560._8_4_ * fVar213;
    auVar54._12_4_ = local_560._12_4_ * fVar229;
    auVar54._16_4_ = local_560._16_4_ * fVar230;
    auVar54._20_4_ = local_560._20_4_ * fVar231;
    uVar74 = local_560._28_4_;
    auVar54._24_4_ = local_560._24_4_ * fVar233;
    auVar54._28_4_ = uVar74;
    auVar26 = vsubps_avx(auVar53,auVar54);
    auVar55._4_4_ = auVar277._4_4_ * fVar210;
    auVar55._0_4_ = auVar277._0_4_ * fVar248;
    auVar55._8_4_ = auVar277._8_4_ * fVar249;
    auVar55._12_4_ = auVar277._12_4_ * fVar215;
    auVar55._16_4_ = auVar277._16_4_ * fVar250;
    auVar55._20_4_ = auVar277._20_4_ * fVar211;
    auVar55._24_4_ = auVar277._24_4_ * fVar251;
    auVar55._28_4_ = uVar74;
    auVar56._4_4_ = auVar247._4_4_ * fVar252;
    auVar56._0_4_ = auVar247._0_4_ * fVar212;
    auVar56._8_4_ = auVar247._8_4_ * fVar213;
    auVar56._12_4_ = auVar247._12_4_ * fVar229;
    auVar56._16_4_ = auVar247._16_4_ * fVar230;
    auVar56._20_4_ = auVar247._20_4_ * fVar231;
    auVar56._24_4_ = auVar247._24_4_ * fVar233;
    auVar56._28_4_ = auVar247._28_4_;
    auVar94 = vsubps_avx(auVar55,auVar56);
    auVar57._4_4_ = fVar210 * fStack_2bc;
    auVar57._0_4_ = fVar248 * local_2c0;
    auVar57._8_4_ = fVar249 * fStack_2b8;
    auVar57._12_4_ = fVar215 * fStack_2b4;
    auVar57._16_4_ = fVar250 * fStack_2b0;
    auVar57._20_4_ = fVar211 * fStack_2ac;
    auVar57._24_4_ = fVar251 * fStack_2a8;
    auVar57._28_4_ = uVar74;
    auVar58._4_4_ = fVar252 * fStack_29c;
    auVar58._0_4_ = fVar212 * local_2a0;
    auVar58._8_4_ = fVar213 * fStack_298;
    auVar58._12_4_ = fVar229 * fStack_294;
    auVar58._16_4_ = fVar230 * fStack_290;
    auVar58._20_4_ = fVar231 * fStack_28c;
    auVar58._24_4_ = fVar233 * fStack_288;
    auVar58._28_4_ = auVar277._28_4_;
    auVar95 = vsubps_avx(auVar57,auVar58);
    auVar59._4_4_ = fVar210 * local_200._4_4_;
    auVar59._0_4_ = fVar248 * local_200._0_4_;
    auVar59._8_4_ = fVar249 * local_200._8_4_;
    auVar59._12_4_ = fVar215 * local_200._12_4_;
    auVar59._16_4_ = fVar250 * local_200._16_4_;
    auVar59._20_4_ = fVar211 * local_200._20_4_;
    auVar59._24_4_ = fVar251 * local_200._24_4_;
    auVar59._28_4_ = auVar277._28_4_;
    auVar60._4_4_ = fStack_65c * fVar252;
    auVar60._0_4_ = local_660 * fVar212;
    auVar60._8_4_ = fStack_658 * fVar213;
    auVar60._12_4_ = fStack_654 * fVar229;
    auVar60._16_4_ = fStack_650 * fVar230;
    auVar60._20_4_ = fStack_64c * fVar231;
    auVar60._24_4_ = fStack_648 * fVar233;
    auVar60._28_4_ = local_240._28_4_;
    auVar96 = vsubps_avx(auVar59,auVar60);
    auVar61._4_4_ = fVar210 * auVar22._4_4_;
    auVar61._0_4_ = fVar248 * auVar22._0_4_;
    auVar61._8_4_ = fVar249 * auVar22._8_4_;
    auVar61._12_4_ = fVar215 * auVar22._12_4_;
    auVar61._16_4_ = fVar250 * auVar22._16_4_;
    auVar61._20_4_ = fVar211 * auVar22._20_4_;
    auVar61._24_4_ = fVar251 * auVar22._24_4_;
    auVar61._28_4_ = auVar17._28_4_ + auVar18._28_4_;
    auVar62._4_4_ = auVar21._4_4_ * fVar252;
    auVar62._0_4_ = auVar21._0_4_ * fVar212;
    auVar62._8_4_ = auVar21._8_4_ * fVar213;
    auVar62._12_4_ = auVar21._12_4_ * fVar229;
    auVar62._16_4_ = auVar21._16_4_ * fVar230;
    auVar62._20_4_ = auVar21._20_4_ * fVar231;
    auVar62._24_4_ = auVar21._24_4_ * fVar233;
    auVar62._28_4_ = auVar20._28_4_ + fVar193;
    auVar22 = vsubps_avx(auVar61,auVar62);
    auVar18 = vminps_avx(auVar23,auVar24);
    auVar17 = vmaxps_avx(auVar23,auVar24);
    auVar19 = vminps_avx(auVar25,auVar26);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar25,auVar26);
    auVar17 = vmaxps_avx(auVar17,auVar18);
    auVar20 = vminps_avx(auVar94,auVar95);
    auVar18 = vmaxps_avx(auVar94,auVar95);
    auVar21 = vminps_avx(auVar96,auVar22);
    auVar20 = vminps_avx(auVar20,auVar21);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar96,auVar22);
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar17,auVar18);
    auVar17 = vcmpps_avx(auVar20,local_1c0,2);
    auVar18 = vcmpps_avx(auVar18,local_1e0,5);
    auVar17 = vandps_avx(auVar18,auVar17);
    auVar93 = vandps_avx(local_2e0,auVar93);
    auVar18 = auVar93 & auVar17;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar93 = vandps_avx(auVar17,auVar93);
      uVar67 = vmovmskps_avx(auVar93);
      if (uVar67 != 0) {
        auStack_4d0[uVar73] = uVar67 & 0xff;
        uVar6 = vmovlps_avx(local_440);
        *(undefined8 *)(afStack_360 + uVar73 * 2) = uVar6;
        uVar7 = vmovlps_avx(auVar104);
        auStack_1a0[uVar73] = uVar7;
        uVar73 = (ulong)((int)uVar73 + 1);
      }
    }
  }
LAB_0099effb:
  do {
    do {
      do {
        do {
          if ((int)uVar73 == 0) {
            if (bVar75) goto LAB_009a0079;
            uVar74 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar103._4_4_ = uVar74;
            auVar103._0_4_ = uVar74;
            auVar103._8_4_ = uVar74;
            auVar103._12_4_ = uVar74;
            auVar103._16_4_ = uVar74;
            auVar103._20_4_ = uVar74;
            auVar103._24_4_ = uVar74;
            auVar103._28_4_ = uVar74;
            auVar93 = vcmpps_avx(local_300,auVar103,2);
            uVar68 = vmovmskps_avx(auVar93);
            uVar69 = (ulong)((uint)uVar76 & uVar68);
            goto LAB_0099e156;
          }
          uVar71 = (int)uVar73 - 1;
          uVar72 = (ulong)uVar71;
          uVar67 = auStack_4d0[uVar72];
          fVar193 = afStack_360[uVar72 * 2];
          fVar248 = afStack_360[uVar72 * 2 + 1];
          auVar324._8_8_ = 0;
          auVar324._0_8_ = auStack_1a0[uVar72];
          auVar329 = ZEXT1664(auVar324);
          uVar7 = 0;
          if (uVar67 != 0) {
            for (; (uVar67 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          uVar67 = uVar67 - 1 & uVar67;
          auStack_4d0[uVar72] = uVar67;
          if (uVar67 == 0) {
            uVar73 = (ulong)uVar71;
          }
          fVar249 = (float)(uVar7 + 1) * 0.14285715;
          fVar210 = (1.0 - (float)uVar7 * 0.14285715) * fVar193 +
                    fVar248 * (float)uVar7 * 0.14285715;
          fVar193 = (1.0 - fVar249) * fVar193 + fVar248 * fVar249;
          fVar248 = fVar193 - fVar210;
          if (0.16666667 <= fVar248) {
            auVar82 = vinsertps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar193),0x10);
            auVar337 = ZEXT1664(auVar82);
            goto LAB_0099e98c;
          }
          auVar82 = vshufps_avx(auVar324,auVar324,0x50);
          auVar108._8_4_ = 0x3f800000;
          auVar108._0_8_ = 0x3f8000003f800000;
          auVar108._12_4_ = 0x3f800000;
          auVar221 = vsubps_avx(auVar108,auVar82);
          fVar249 = auVar82._0_4_;
          fVar215 = auVar82._4_4_;
          fVar250 = auVar82._8_4_;
          fVar211 = auVar82._12_4_;
          fVar251 = auVar221._0_4_;
          fVar212 = auVar221._4_4_;
          fVar252 = auVar221._8_4_;
          fVar213 = auVar221._12_4_;
          auVar140._0_4_ = auVar283._0_4_ * fVar249 + fVar251 * fVar253;
          auVar140._4_4_ = auVar283._4_4_ * fVar215 + fVar212 * fVar216;
          auVar140._8_4_ = auVar283._0_4_ * fVar250 + fVar252 * fVar253;
          auVar140._12_4_ = auVar283._4_4_ * fVar211 + fVar213 * fVar216;
          auVar179._0_4_ = auVar258._0_4_ * fVar249 + fVar251 * fVar214;
          auVar179._4_4_ = auVar258._4_4_ * fVar215 + fVar212 * fVar228;
          auVar179._8_4_ = auVar258._0_4_ * fVar250 + fVar252 * fVar214;
          auVar179._12_4_ = auVar258._4_4_ * fVar211 + fVar213 * fVar228;
          auVar200._0_4_ = auVar271._0_4_ * fVar249 + auVar322._0_4_ * fVar251;
          auVar200._4_4_ = auVar271._4_4_ * fVar215 + auVar322._4_4_ * fVar212;
          auVar200._8_4_ = auVar271._0_4_ * fVar250 + auVar322._0_4_ * fVar252;
          auVar200._12_4_ = auVar271._4_4_ * fVar211 + auVar322._4_4_ * fVar213;
          auVar79._0_4_ = auVar107._0_4_ * fVar249 + auVar314._0_4_ * fVar251;
          auVar79._4_4_ = auVar107._4_4_ * fVar215 + auVar314._4_4_ * fVar212;
          auVar79._8_4_ = auVar107._0_4_ * fVar250 + auVar314._0_4_ * fVar252;
          auVar79._12_4_ = auVar107._4_4_ * fVar211 + auVar314._4_4_ * fVar213;
          auVar132._16_16_ = auVar140;
          auVar132._0_16_ = auVar140;
          auVar161._16_16_ = auVar179;
          auVar161._0_16_ = auVar179;
          auVar192._16_16_ = auVar200;
          auVar192._0_16_ = auVar200;
          auVar93 = ZEXT2032(CONCAT416(fVar193,ZEXT416((uint)fVar210)));
          auVar93 = vshufps_avx(auVar93,auVar93,0);
          auVar17 = vsubps_avx(auVar161,auVar132);
          fVar249 = auVar93._0_4_;
          fVar215 = auVar93._4_4_;
          fVar250 = auVar93._8_4_;
          fVar211 = auVar93._12_4_;
          fVar251 = auVar93._16_4_;
          fVar212 = auVar93._20_4_;
          fVar252 = auVar93._24_4_;
          auVar133._0_4_ = auVar140._0_4_ + auVar17._0_4_ * fVar249;
          auVar133._4_4_ = auVar140._4_4_ + auVar17._4_4_ * fVar215;
          auVar133._8_4_ = auVar140._8_4_ + auVar17._8_4_ * fVar250;
          auVar133._12_4_ = auVar140._12_4_ + auVar17._12_4_ * fVar211;
          auVar133._16_4_ = auVar140._0_4_ + auVar17._16_4_ * fVar251;
          auVar133._20_4_ = auVar140._4_4_ + auVar17._20_4_ * fVar212;
          auVar133._24_4_ = auVar140._8_4_ + auVar17._24_4_ * fVar252;
          auVar133._28_4_ = auVar140._12_4_ + auVar17._28_4_;
          auVar93 = vsubps_avx(auVar192,auVar161);
          auVar162._0_4_ = auVar179._0_4_ + auVar93._0_4_ * fVar249;
          auVar162._4_4_ = auVar179._4_4_ + auVar93._4_4_ * fVar215;
          auVar162._8_4_ = auVar179._8_4_ + auVar93._8_4_ * fVar250;
          auVar162._12_4_ = auVar179._12_4_ + auVar93._12_4_ * fVar211;
          auVar162._16_4_ = auVar179._0_4_ + auVar93._16_4_ * fVar251;
          auVar162._20_4_ = auVar179._4_4_ + auVar93._20_4_ * fVar212;
          auVar162._24_4_ = auVar179._8_4_ + auVar93._24_4_ * fVar252;
          auVar162._28_4_ = auVar179._12_4_ + auVar93._28_4_;
          auVar82 = vsubps_avx(auVar79,auVar200);
          auVar100._0_4_ = auVar200._0_4_ + auVar82._0_4_ * fVar249;
          auVar100._4_4_ = auVar200._4_4_ + auVar82._4_4_ * fVar215;
          auVar100._8_4_ = auVar200._8_4_ + auVar82._8_4_ * fVar250;
          auVar100._12_4_ = auVar200._12_4_ + auVar82._12_4_ * fVar211;
          auVar100._16_4_ = auVar200._0_4_ + auVar82._0_4_ * fVar251;
          auVar100._20_4_ = auVar200._4_4_ + auVar82._4_4_ * fVar212;
          auVar100._24_4_ = auVar200._8_4_ + auVar82._8_4_ * fVar252;
          auVar100._28_4_ = auVar200._12_4_ + auVar82._12_4_;
          auVar93 = vsubps_avx(auVar162,auVar133);
          auVar134._0_4_ = auVar133._0_4_ + fVar249 * auVar93._0_4_;
          auVar134._4_4_ = auVar133._4_4_ + fVar215 * auVar93._4_4_;
          auVar134._8_4_ = auVar133._8_4_ + fVar250 * auVar93._8_4_;
          auVar134._12_4_ = auVar133._12_4_ + fVar211 * auVar93._12_4_;
          auVar134._16_4_ = auVar133._16_4_ + fVar251 * auVar93._16_4_;
          auVar134._20_4_ = auVar133._20_4_ + fVar212 * auVar93._20_4_;
          auVar134._24_4_ = auVar133._24_4_ + fVar252 * auVar93._24_4_;
          auVar134._28_4_ = auVar133._28_4_ + auVar93._28_4_;
          auVar93 = vsubps_avx(auVar100,auVar162);
          auVar101._0_4_ = auVar162._0_4_ + fVar249 * auVar93._0_4_;
          auVar101._4_4_ = auVar162._4_4_ + fVar215 * auVar93._4_4_;
          auVar101._8_4_ = auVar162._8_4_ + fVar250 * auVar93._8_4_;
          auVar101._12_4_ = auVar162._12_4_ + fVar211 * auVar93._12_4_;
          auVar101._16_4_ = auVar162._16_4_ + fVar251 * auVar93._16_4_;
          auVar101._20_4_ = auVar162._20_4_ + fVar212 * auVar93._20_4_;
          auVar101._24_4_ = auVar162._24_4_ + fVar252 * auVar93._24_4_;
          auVar101._28_4_ = auVar162._28_4_ + auVar93._28_4_;
          auVar93 = vsubps_avx(auVar101,auVar134);
          auVar224._0_4_ = auVar134._0_4_ + fVar249 * auVar93._0_4_;
          auVar224._4_4_ = auVar134._4_4_ + fVar215 * auVar93._4_4_;
          auVar224._8_4_ = auVar134._8_4_ + fVar250 * auVar93._8_4_;
          auVar224._12_4_ = auVar134._12_4_ + fVar211 * auVar93._12_4_;
          auVar227._16_4_ = auVar134._16_4_ + fVar251 * auVar93._16_4_;
          auVar227._0_16_ = auVar224;
          auVar227._20_4_ = auVar134._20_4_ + fVar212 * auVar93._20_4_;
          auVar227._24_4_ = auVar134._24_4_ + fVar252 * auVar93._24_4_;
          auVar227._28_4_ = auVar134._28_4_ + auVar162._28_4_;
          auVar232 = auVar227._16_16_;
          auVar110 = vshufps_avx(ZEXT416((uint)(fVar248 * 0.33333334)),
                                 ZEXT416((uint)(fVar248 * 0.33333334)),0);
          auVar180._0_4_ = auVar224._0_4_ + auVar110._0_4_ * auVar93._0_4_ * 3.0;
          auVar180._4_4_ = auVar224._4_4_ + auVar110._4_4_ * auVar93._4_4_ * 3.0;
          auVar180._8_4_ = auVar224._8_4_ + auVar110._8_4_ * auVar93._8_4_ * 3.0;
          auVar180._12_4_ = auVar224._12_4_ + auVar110._12_4_ * auVar93._12_4_ * 3.0;
          auVar156 = vshufpd_avx(auVar224,auVar224,3);
          auVar122 = vshufpd_avx(auVar232,auVar232,3);
          _local_560 = auVar156;
          auVar82 = vsubps_avx(auVar156,auVar224);
          auVar221 = vsubps_avx(auVar122,auVar232);
          auVar80._0_4_ = auVar82._0_4_ + auVar221._0_4_;
          auVar80._4_4_ = auVar82._4_4_ + auVar221._4_4_;
          auVar80._8_4_ = auVar82._8_4_ + auVar221._8_4_;
          auVar80._12_4_ = auVar82._12_4_ + auVar221._12_4_;
          auVar82 = vmovshdup_avx(auVar224);
          auVar221 = vmovshdup_avx(auVar180);
          auVar142 = vshufps_avx(auVar80,auVar80,0);
          auVar111 = vshufps_avx(auVar80,auVar80,0x55);
          fVar249 = auVar111._0_4_;
          fVar215 = auVar111._4_4_;
          fVar250 = auVar111._8_4_;
          fVar211 = auVar111._12_4_;
          fVar251 = auVar142._0_4_;
          fVar212 = auVar142._4_4_;
          fVar252 = auVar142._8_4_;
          fVar213 = auVar142._12_4_;
          auVar81._0_4_ = fVar251 * auVar224._0_4_ + auVar82._0_4_ * fVar249;
          auVar81._4_4_ = fVar212 * auVar224._4_4_ + auVar82._4_4_ * fVar215;
          auVar81._8_4_ = fVar252 * auVar224._8_4_ + auVar82._8_4_ * fVar250;
          auVar81._12_4_ = fVar213 * auVar224._12_4_ + auVar82._12_4_ * fVar211;
          auVar294._0_4_ = fVar251 * auVar180._0_4_ + auVar221._0_4_ * fVar249;
          auVar294._4_4_ = fVar212 * auVar180._4_4_ + auVar221._4_4_ * fVar215;
          auVar294._8_4_ = fVar252 * auVar180._8_4_ + auVar221._8_4_ * fVar250;
          auVar294._12_4_ = fVar213 * auVar180._12_4_ + auVar221._12_4_ * fVar211;
          auVar221 = vshufps_avx(auVar81,auVar81,0xe8);
          auVar142 = vshufps_avx(auVar294,auVar294,0xe8);
          auVar82 = vcmpps_avx(auVar221,auVar142,1);
          uVar67 = vextractps_avx(auVar82,0);
          auVar111 = auVar294;
          if ((uVar67 & 1) == 0) {
            auVar111 = auVar81;
          }
          auVar109._0_4_ = auVar110._0_4_ * auVar93._16_4_ * 3.0;
          auVar109._4_4_ = auVar110._4_4_ * auVar93._20_4_ * 3.0;
          auVar109._8_4_ = auVar110._8_4_ * auVar93._24_4_ * 3.0;
          auVar109._12_4_ = auVar110._12_4_ * 0.0;
          auVar77 = vsubps_avx(auVar232,auVar109);
          auVar110 = vmovshdup_avx(auVar77);
          auVar232 = vmovshdup_avx(auVar232);
          fVar229 = auVar77._0_4_;
          fVar230 = auVar77._4_4_;
          auVar201._0_4_ = fVar229 * fVar251 + auVar110._0_4_ * fVar249;
          auVar201._4_4_ = fVar230 * fVar212 + auVar110._4_4_ * fVar215;
          auVar201._8_4_ = auVar77._8_4_ * fVar252 + auVar110._8_4_ * fVar250;
          auVar201._12_4_ = auVar77._12_4_ * fVar213 + auVar110._12_4_ * fVar211;
          auVar334._0_4_ = fVar251 * auVar227._16_4_ + auVar232._0_4_ * fVar249;
          auVar334._4_4_ = fVar212 * auVar227._20_4_ + auVar232._4_4_ * fVar215;
          auVar334._8_4_ = fVar252 * auVar227._24_4_ + auVar232._8_4_ * fVar250;
          auVar334._12_4_ = fVar213 * auVar227._28_4_ + auVar232._12_4_ * fVar211;
          auVar232 = vshufps_avx(auVar201,auVar201,0xe8);
          auVar269 = vshufps_avx(auVar334,auVar334,0xe8);
          auVar110 = vcmpps_avx(auVar232,auVar269,1);
          uVar67 = vextractps_avx(auVar110,0);
          auVar104 = auVar334;
          if ((uVar67 & 1) == 0) {
            auVar104 = auVar201;
          }
          auVar111 = vmaxss_avx(auVar104,auVar111);
          auVar221 = vminps_avx(auVar221,auVar142);
          auVar142 = vminps_avx(auVar232,auVar269);
          auVar142 = vminps_avx(auVar221,auVar142);
          auVar82 = vshufps_avx(auVar82,auVar82,0x55);
          auVar82 = vblendps_avx(auVar82,auVar110,2);
          auVar110 = vpslld_avx(auVar82,0x1f);
          auVar82 = vshufpd_avx(auVar294,auVar294,1);
          auVar82 = vinsertps_avx(auVar82,auVar334,0x9c);
          auVar221 = vshufpd_avx(auVar81,auVar81,1);
          auVar221 = vinsertps_avx(auVar221,auVar201,0x9c);
          auVar82 = vblendvps_avx(auVar221,auVar82,auVar110);
          auVar221 = vmovshdup_avx(auVar82);
          auVar82 = vmaxss_avx(auVar221,auVar82);
          fVar250 = auVar142._0_4_;
          auVar221 = vmovshdup_avx(auVar142);
          fVar215 = auVar82._0_4_;
          fVar211 = auVar221._0_4_;
          fVar249 = auVar111._0_4_;
          if ((fVar250 < 0.0001) && (-0.0001 < fVar215)) break;
          if ((fVar211 < 0.0001 && -0.0001 < fVar249) || (fVar250 < 0.0001 && -0.0001 < fVar249))
          break;
          auVar110 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar82,1);
          auVar221 = vcmpps_avx(auVar221,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar221 = vandps_avx(auVar221,auVar110);
        } while ((auVar221 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
        auVar110 = vcmpps_avx(auVar142,_DAT_01f45a50,1);
        auVar221 = vcmpss_avx(auVar111,ZEXT416(0) << 0x20,1);
        auVar141._8_4_ = 0x3f800000;
        auVar141._0_8_ = 0x3f8000003f800000;
        auVar141._12_4_ = 0x3f800000;
        auVar181._8_4_ = 0xbf800000;
        auVar181._0_8_ = 0xbf800000bf800000;
        auVar181._12_4_ = 0xbf800000;
        auVar221 = vblendvps_avx(auVar141,auVar181,auVar221);
        auVar110 = vblendvps_avx(auVar141,auVar181,auVar110);
        auVar142 = vcmpss_avx(auVar110,auVar221,4);
        auVar142 = vpshufd_avx(ZEXT416(auVar142._0_4_ & 1),0x50);
        auVar142 = vpslld_avx(auVar142,0x1f);
        auVar142 = vpsrad_avx(auVar142,0x1f);
        auVar142 = vpandn_avx(auVar142,_DAT_01f7afb0);
        auVar111 = vmovshdup_avx(auVar110);
        fVar251 = auVar111._0_4_;
        if ((auVar110._0_4_ != fVar251) || (NAN(auVar110._0_4_) || NAN(fVar251))) {
          if ((fVar211 != fVar250) || (NAN(fVar211) || NAN(fVar250))) {
            fVar250 = -fVar250 / (fVar211 - fVar250);
            auVar110 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar250) * 0.0 + fVar250)));
          }
          else {
            auVar110 = ZEXT816(0x3f80000000000000);
            if ((fVar250 != 0.0) || (NAN(fVar250))) {
              auVar110 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar232 = vcmpps_avx(auVar142,auVar110,1);
          auVar111 = vblendps_avx(auVar142,auVar110,2);
          auVar110 = vblendps_avx(auVar110,auVar142,2);
          auVar142 = vblendvps_avx(auVar110,auVar111,auVar232);
        }
        auVar82 = vcmpss_avx(auVar82,ZEXT416(0) << 0x20,1);
        auVar143._8_4_ = 0x3f800000;
        auVar143._0_8_ = 0x3f8000003f800000;
        auVar143._12_4_ = 0x3f800000;
        auVar182._8_4_ = 0xbf800000;
        auVar182._0_8_ = 0xbf800000bf800000;
        auVar182._12_4_ = 0xbf800000;
        auVar82 = vblendvps_avx(auVar143,auVar182,auVar82);
        fVar250 = auVar82._0_4_;
        if ((auVar221._0_4_ != fVar250) || (NAN(auVar221._0_4_) || NAN(fVar250))) {
          if ((fVar215 != fVar249) || (NAN(fVar215) || NAN(fVar249))) {
            fVar249 = -fVar249 / (fVar215 - fVar249);
            auVar82 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar249) * 0.0 + fVar249)));
          }
          else {
            auVar82 = ZEXT816(0x3f80000000000000);
            if ((fVar249 != 0.0) || (NAN(fVar249))) {
              auVar82 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar110 = vcmpps_avx(auVar142,auVar82,1);
          auVar221 = vblendps_avx(auVar142,auVar82,2);
          auVar82 = vblendps_avx(auVar82,auVar142,2);
          auVar142 = vblendvps_avx(auVar82,auVar221,auVar110);
        }
        if ((fVar251 != fVar250) || (NAN(fVar251) || NAN(fVar250))) {
          auVar83._8_4_ = 0x3f800000;
          auVar83._0_8_ = 0x3f8000003f800000;
          auVar83._12_4_ = 0x3f800000;
          auVar82 = vcmpps_avx(auVar142,auVar83,1);
          auVar221 = vinsertps_avx(auVar142,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar144._4_12_ = auVar142._4_12_;
          auVar144._0_4_ = 0x3f800000;
          auVar142 = vblendvps_avx(auVar144,auVar221,auVar82);
        }
        auVar82 = vcmpps_avx(auVar142,_DAT_01f46740,1);
        auVar64._12_4_ = 0;
        auVar64._0_12_ = auVar142._4_12_;
        auVar221 = vinsertps_avx(auVar142,ZEXT416(0x3f800000),0x10);
        auVar82 = vblendvps_avx(auVar221,auVar64 << 0x20,auVar82);
        auVar221 = vmovshdup_avx(auVar82);
      } while (auVar221._0_4_ < auVar82._0_4_);
      auVar84._0_4_ = auVar82._0_4_ + -0.1;
      auVar84._4_4_ = auVar82._4_4_ + 0.1;
      auVar84._8_4_ = auVar82._8_4_ + 0.0;
      auVar84._12_4_ = auVar82._12_4_ + 0.0;
      auVar110 = vshufpd_avx(auVar180,auVar180,3);
      auVar225._8_8_ = 0x3f80000000000000;
      auVar225._0_8_ = 0x3f80000000000000;
      auVar82 = vcmpps_avx(auVar84,auVar225,1);
      auVar63._12_4_ = 0;
      auVar63._0_12_ = auVar84._4_12_;
      auVar221 = vinsertps_avx(auVar84,SUB6416(ZEXT464(0x3f800000),0),0x10);
      auVar82 = vblendvps_avx(auVar221,auVar63 << 0x20,auVar82);
      auVar221 = vshufpd_avx(auVar77,auVar77,3);
      auVar142 = vshufps_avx(auVar82,auVar82,0x50);
      auVar325._8_4_ = 0x3f800000;
      auVar325._0_8_ = 0x3f8000003f800000;
      auVar325._12_4_ = 0x3f800000;
      auVar111 = vsubps_avx(auVar325,auVar142);
      local_560._0_4_ = auVar156._0_4_;
      local_560._4_4_ = auVar156._4_4_;
      fStack_558 = auVar156._8_4_;
      fStack_554 = auVar156._12_4_;
      fVar249 = auVar142._0_4_;
      fVar215 = auVar142._4_4_;
      fVar250 = auVar142._8_4_;
      fVar211 = auVar142._12_4_;
      local_6c0 = auVar122._0_4_;
      fStack_6bc = auVar122._4_4_;
      fStack_6b8 = auVar122._8_4_;
      fStack_6b4 = auVar122._12_4_;
      fVar251 = auVar111._0_4_;
      fVar212 = auVar111._4_4_;
      fVar252 = auVar111._8_4_;
      fVar213 = auVar111._12_4_;
      auVar85._0_4_ = fVar249 * (float)local_560._0_4_ + fVar251 * auVar224._0_4_;
      auVar85._4_4_ = fVar215 * (float)local_560._4_4_ + fVar212 * auVar224._4_4_;
      auVar85._8_4_ = fVar250 * fStack_558 + fVar252 * auVar224._0_4_;
      auVar85._12_4_ = fVar211 * fStack_554 + fVar213 * auVar224._4_4_;
      auVar202._0_4_ = auVar110._0_4_ * fVar249 + fVar251 * auVar180._0_4_;
      auVar202._4_4_ = auVar110._4_4_ * fVar215 + fVar212 * auVar180._4_4_;
      auVar202._8_4_ = auVar110._8_4_ * fVar250 + fVar252 * auVar180._0_4_;
      auVar202._12_4_ = auVar110._12_4_ * fVar211 + fVar213 * auVar180._4_4_;
      auVar242._0_4_ = auVar221._0_4_ * fVar249 + fVar251 * fVar229;
      auVar242._4_4_ = auVar221._4_4_ * fVar215 + fVar212 * fVar230;
      auVar242._8_4_ = auVar221._8_4_ * fVar250 + fVar252 * fVar229;
      auVar242._12_4_ = auVar221._12_4_ * fVar211 + fVar213 * fVar230;
      auVar284._0_4_ = fVar249 * local_6c0 + fVar251 * auVar227._16_4_;
      auVar284._4_4_ = fVar215 * fStack_6bc + fVar212 * auVar227._20_4_;
      auVar284._8_4_ = fVar250 * fStack_6b8 + fVar252 * auVar227._16_4_;
      auVar284._12_4_ = fVar211 * fStack_6b4 + fVar213 * auVar227._20_4_;
      auVar122 = vsubps_avx(auVar325,auVar82);
      auVar221 = vmovshdup_avx(auVar324);
      auVar156 = vmovsldup_avx(auVar324);
      auVar335._0_4_ = auVar122._0_4_ * auVar156._0_4_ + auVar82._0_4_ * auVar221._0_4_;
      auVar335._4_4_ = auVar122._4_4_ * auVar156._4_4_ + auVar82._4_4_ * auVar221._4_4_;
      auVar335._8_4_ = auVar122._8_4_ * auVar156._8_4_ + auVar82._8_4_ * auVar221._8_4_;
      auVar335._12_4_ = auVar122._12_4_ * auVar156._12_4_ + auVar82._12_4_ * auVar221._12_4_;
      auVar77 = vmovshdup_avx(auVar335);
      auVar82 = vsubps_avx(auVar202,auVar85);
      auVar145._0_4_ = auVar82._0_4_ * 3.0;
      auVar145._4_4_ = auVar82._4_4_ * 3.0;
      auVar145._8_4_ = auVar82._8_4_ * 3.0;
      auVar145._12_4_ = auVar82._12_4_ * 3.0;
      auVar82 = vsubps_avx(auVar242,auVar202);
      auVar168._0_4_ = auVar82._0_4_ * 3.0;
      auVar168._4_4_ = auVar82._4_4_ * 3.0;
      auVar168._8_4_ = auVar82._8_4_ * 3.0;
      auVar168._12_4_ = auVar82._12_4_ * 3.0;
      auVar82 = vsubps_avx(auVar284,auVar242);
      auVar259._0_4_ = auVar82._0_4_ * 3.0;
      auVar259._4_4_ = auVar82._4_4_ * 3.0;
      auVar259._8_4_ = auVar82._8_4_ * 3.0;
      auVar259._12_4_ = auVar82._12_4_ * 3.0;
      auVar221 = vminps_avx(auVar168,auVar259);
      auVar82 = vmaxps_avx(auVar168,auVar259);
      auVar221 = vminps_avx(auVar145,auVar221);
      auVar82 = vmaxps_avx(auVar145,auVar82);
      auVar156 = vshufpd_avx(auVar221,auVar221,3);
      auVar122 = vshufpd_avx(auVar82,auVar82,3);
      auVar221 = vminps_avx(auVar221,auVar156);
      auVar82 = vmaxps_avx(auVar82,auVar122);
      auVar156 = vshufps_avx(ZEXT416((uint)(1.0 / fVar248)),ZEXT416((uint)(1.0 / fVar248)),0);
      auVar260._0_4_ = auVar156._0_4_ * auVar221._0_4_;
      auVar260._4_4_ = auVar156._4_4_ * auVar221._4_4_;
      auVar260._8_4_ = auVar156._8_4_ * auVar221._8_4_;
      auVar260._12_4_ = auVar156._12_4_ * auVar221._12_4_;
      auVar272._0_4_ = auVar156._0_4_ * auVar82._0_4_;
      auVar272._4_4_ = auVar156._4_4_ * auVar82._4_4_;
      auVar272._8_4_ = auVar156._8_4_ * auVar82._8_4_;
      auVar272._12_4_ = auVar156._12_4_ * auVar82._12_4_;
      auVar111 = ZEXT416((uint)(1.0 / (auVar77._0_4_ - auVar335._0_4_)));
      auVar82 = vshufpd_avx(auVar85,auVar85,3);
      auVar221 = vshufpd_avx(auVar202,auVar202,3);
      auVar156 = vshufpd_avx(auVar242,auVar242,3);
      auVar122 = vshufpd_avx(auVar284,auVar284,3);
      auVar82 = vsubps_avx(auVar82,auVar85);
      auVar110 = vsubps_avx(auVar221,auVar202);
      auVar142 = vsubps_avx(auVar156,auVar242);
      auVar122 = vsubps_avx(auVar122,auVar284);
      auVar221 = vminps_avx(auVar82,auVar110);
      auVar82 = vmaxps_avx(auVar82,auVar110);
      auVar156 = vminps_avx(auVar142,auVar122);
      auVar156 = vminps_avx(auVar221,auVar156);
      auVar221 = vmaxps_avx(auVar142,auVar122);
      auVar82 = vmaxps_avx(auVar82,auVar221);
      auVar221 = vshufps_avx(auVar111,auVar111,0);
      auVar315._0_4_ = auVar221._0_4_ * auVar156._0_4_;
      auVar315._4_4_ = auVar221._4_4_ * auVar156._4_4_;
      auVar315._8_4_ = auVar221._8_4_ * auVar156._8_4_;
      auVar315._12_4_ = auVar221._12_4_ * auVar156._12_4_;
      auVar326._0_4_ = auVar221._0_4_ * auVar82._0_4_;
      auVar326._4_4_ = auVar221._4_4_ * auVar82._4_4_;
      auVar326._8_4_ = auVar221._8_4_ * auVar82._8_4_;
      auVar326._12_4_ = auVar221._12_4_ * auVar82._12_4_;
      auVar82 = vmovsldup_avx(auVar335);
      auVar285._4_12_ = auVar82._4_12_;
      auVar285._0_4_ = fVar210;
      auVar295._4_12_ = auVar335._4_12_;
      auVar295._0_4_ = fVar193;
      auVar169._0_4_ = (fVar210 + fVar193) * 0.5;
      auVar169._4_4_ = (auVar82._4_4_ + auVar335._4_4_) * 0.5;
      auVar169._8_4_ = (auVar82._8_4_ + auVar335._8_4_) * 0.5;
      auVar169._12_4_ = (auVar82._12_4_ + auVar335._12_4_) * 0.5;
      auVar82 = vshufps_avx(auVar169,auVar169,0);
      fVar249 = auVar82._0_4_;
      fVar215 = auVar82._4_4_;
      fVar250 = auVar82._8_4_;
      fVar211 = auVar82._12_4_;
      local_6d0._0_4_ = auVar8._0_4_;
      local_6d0._4_4_ = auVar8._4_4_;
      fStack_6c8 = auVar8._8_4_;
      fStack_6c4 = auVar8._12_4_;
      auVar112._0_4_ = fVar249 * (float)local_370._0_4_ + (float)local_6d0._0_4_;
      auVar112._4_4_ = fVar215 * (float)local_370._4_4_ + (float)local_6d0._4_4_;
      auVar112._8_4_ = fVar250 * fStack_368 + fStack_6c8;
      auVar112._12_4_ = fVar211 * fStack_364 + fStack_6c4;
      local_5b0 = auVar293._0_4_;
      fStack_5ac = auVar293._4_4_;
      fStack_5a8 = auVar293._8_4_;
      fStack_5a4 = auVar293._12_4_;
      auVar146._0_4_ = fVar249 * (float)local_380._0_4_ + local_5b0;
      auVar146._4_4_ = fVar215 * (float)local_380._4_4_ + fStack_5ac;
      auVar146._8_4_ = fVar250 * fStack_378 + fStack_5a8;
      auVar146._12_4_ = fVar211 * fStack_374 + fStack_5a4;
      local_5c0 = auVar9._0_4_;
      fStack_5bc = auVar9._4_4_;
      fStack_5b8 = auVar9._8_4_;
      fStack_5b4 = auVar9._12_4_;
      auVar203._0_4_ = fVar249 * (float)local_390._0_4_ + local_5c0;
      auVar203._4_4_ = fVar215 * (float)local_390._4_4_ + fStack_5bc;
      auVar203._8_4_ = fVar250 * fStack_388 + fStack_5b8;
      auVar203._12_4_ = fVar211 * fStack_384 + fStack_5b4;
      auVar82 = vsubps_avx(auVar146,auVar112);
      auVar113._0_4_ = auVar112._0_4_ + fVar249 * auVar82._0_4_;
      auVar113._4_4_ = auVar112._4_4_ + fVar215 * auVar82._4_4_;
      auVar113._8_4_ = auVar112._8_4_ + fVar250 * auVar82._8_4_;
      auVar113._12_4_ = auVar112._12_4_ + fVar211 * auVar82._12_4_;
      auVar82 = vsubps_avx(auVar203,auVar146);
      auVar147._0_4_ = auVar146._0_4_ + fVar249 * auVar82._0_4_;
      auVar147._4_4_ = auVar146._4_4_ + fVar215 * auVar82._4_4_;
      auVar147._8_4_ = auVar146._8_4_ + fVar250 * auVar82._8_4_;
      auVar147._12_4_ = auVar146._12_4_ + fVar211 * auVar82._12_4_;
      auVar82 = vsubps_avx(auVar147,auVar113);
      fVar249 = auVar113._0_4_ + fVar249 * auVar82._0_4_;
      fVar215 = auVar113._4_4_ + fVar215 * auVar82._4_4_;
      auVar86._0_8_ = CONCAT44(fVar215,fVar249);
      auVar86._8_4_ = auVar113._8_4_ + fVar250 * auVar82._8_4_;
      auVar86._12_4_ = auVar113._12_4_ + fVar211 * auVar82._12_4_;
      fVar250 = auVar82._0_4_ * 3.0;
      fVar211 = auVar82._4_4_ * 3.0;
      auVar114._0_8_ = CONCAT44(fVar211,fVar250);
      auVar114._8_4_ = auVar82._8_4_ * 3.0;
      auVar114._12_4_ = auVar82._12_4_ * 3.0;
      auVar148._8_8_ = auVar86._0_8_;
      auVar148._0_8_ = auVar86._0_8_;
      auVar82 = vshufpd_avx(auVar86,auVar86,3);
      auVar221 = vshufps_avx(auVar169,auVar169,0x55);
      auVar142 = vsubps_avx(auVar82,auVar148);
      auVar304._0_4_ = auVar142._0_4_ * auVar221._0_4_ + fVar249;
      auVar304._4_4_ = auVar142._4_4_ * auVar221._4_4_ + fVar215;
      auVar304._8_4_ = auVar142._8_4_ * auVar221._8_4_ + fVar249;
      auVar304._12_4_ = auVar142._12_4_ * auVar221._12_4_ + fVar215;
      auVar149._8_8_ = auVar114._0_8_;
      auVar149._0_8_ = auVar114._0_8_;
      auVar82 = vshufpd_avx(auVar114,auVar114,1);
      auVar82 = vsubps_avx(auVar82,auVar149);
      auVar115._0_4_ = auVar82._0_4_ * auVar221._0_4_ + fVar250;
      auVar115._4_4_ = auVar82._4_4_ * auVar221._4_4_ + fVar211;
      auVar115._8_4_ = auVar82._8_4_ * auVar221._8_4_ + fVar250;
      auVar115._12_4_ = auVar82._12_4_ * auVar221._12_4_ + fVar211;
      auVar221 = vmovshdup_avx(auVar115);
      auVar204._0_8_ = auVar221._0_8_ ^ 0x8000000080000000;
      auVar204._8_4_ = auVar221._8_4_ ^ 0x80000000;
      auVar204._12_4_ = auVar221._12_4_ ^ 0x80000000;
      auVar156 = vmovshdup_avx(auVar142);
      auVar82 = vunpcklps_avx(auVar156,auVar204);
      auVar122 = vshufps_avx(auVar82,auVar204,4);
      auVar87._0_8_ = auVar142._0_8_ ^ 0x8000000080000000;
      auVar87._8_4_ = -auVar142._8_4_;
      auVar87._12_4_ = -auVar142._12_4_;
      auVar82 = vmovlhps_avx(auVar87,auVar115);
      auVar110 = vshufps_avx(auVar82,auVar115,8);
      auVar82 = ZEXT416((uint)(auVar115._0_4_ * auVar156._0_4_ - auVar142._0_4_ * auVar221._0_4_));
      auVar221 = vshufps_avx(auVar82,auVar82,0);
      auVar82 = vdivps_avx(auVar122,auVar221);
      auVar221 = vdivps_avx(auVar110,auVar221);
      auVar110 = vinsertps_avx(auVar260,auVar315,0x1c);
      auVar142 = vinsertps_avx(auVar272,auVar326,0x1c);
      auVar111 = vinsertps_avx(auVar315,auVar260,0x4c);
      auVar232 = vinsertps_avx(auVar326,auVar272,0x4c);
      auVar156 = vmovsldup_avx(auVar82);
      auVar150._0_4_ = auVar156._0_4_ * auVar110._0_4_;
      auVar150._4_4_ = auVar156._4_4_ * auVar110._4_4_;
      auVar150._8_4_ = auVar156._8_4_ * auVar110._8_4_;
      auVar150._12_4_ = auVar156._12_4_ * auVar110._12_4_;
      auVar116._0_4_ = auVar142._0_4_ * auVar156._0_4_;
      auVar116._4_4_ = auVar142._4_4_ * auVar156._4_4_;
      auVar116._8_4_ = auVar142._8_4_ * auVar156._8_4_;
      auVar116._12_4_ = auVar142._12_4_ * auVar156._12_4_;
      auVar122 = vminps_avx(auVar150,auVar116);
      auVar156 = vmaxps_avx(auVar116,auVar150);
      auVar269 = vmovsldup_avx(auVar221);
      auVar327._0_4_ = auVar111._0_4_ * auVar269._0_4_;
      auVar327._4_4_ = auVar111._4_4_ * auVar269._4_4_;
      auVar327._8_4_ = auVar111._8_4_ * auVar269._8_4_;
      auVar327._12_4_ = auVar111._12_4_ * auVar269._12_4_;
      auVar151._0_4_ = auVar232._0_4_ * auVar269._0_4_;
      auVar151._4_4_ = auVar232._4_4_ * auVar269._4_4_;
      auVar151._8_4_ = auVar232._8_4_ * auVar269._8_4_;
      auVar151._12_4_ = auVar232._12_4_ * auVar269._12_4_;
      auVar269 = vminps_avx(auVar327,auVar151);
      auVar183._0_4_ = auVar122._0_4_ + auVar269._0_4_;
      auVar183._4_4_ = auVar122._4_4_ + auVar269._4_4_;
      auVar183._8_4_ = auVar122._8_4_ + auVar269._8_4_;
      auVar183._12_4_ = auVar122._12_4_ + auVar269._12_4_;
      auVar122 = vmaxps_avx(auVar151,auVar327);
      auVar269 = vsubps_avx(auVar285,auVar169);
      auVar104 = vsubps_avx(auVar295,auVar169);
      auVar117._0_4_ = auVar156._0_4_ + auVar122._0_4_;
      auVar117._4_4_ = auVar156._4_4_ + auVar122._4_4_;
      auVar117._8_4_ = auVar156._8_4_ + auVar122._8_4_;
      auVar117._12_4_ = auVar156._12_4_ + auVar122._12_4_;
      auVar152._8_8_ = 0x3f800000;
      auVar152._0_8_ = 0x3f800000;
      auVar156 = vsubps_avx(auVar152,auVar117);
      auVar122 = vsubps_avx(auVar152,auVar183);
      fVar252 = auVar269._0_4_;
      auVar184._0_4_ = fVar252 * auVar156._0_4_;
      fVar213 = auVar269._4_4_;
      auVar184._4_4_ = fVar213 * auVar156._4_4_;
      fVar229 = auVar269._8_4_;
      auVar184._8_4_ = fVar229 * auVar156._8_4_;
      fVar230 = auVar269._12_4_;
      auVar184._12_4_ = fVar230 * auVar156._12_4_;
      fVar250 = auVar104._0_4_;
      auVar118._0_4_ = fVar250 * auVar156._0_4_;
      fVar211 = auVar104._4_4_;
      auVar118._4_4_ = fVar211 * auVar156._4_4_;
      fVar251 = auVar104._8_4_;
      auVar118._8_4_ = fVar251 * auVar156._8_4_;
      fVar212 = auVar104._12_4_;
      auVar118._12_4_ = fVar212 * auVar156._12_4_;
      auVar286._0_4_ = fVar252 * auVar122._0_4_;
      auVar286._4_4_ = fVar213 * auVar122._4_4_;
      auVar286._8_4_ = fVar229 * auVar122._8_4_;
      auVar286._12_4_ = fVar230 * auVar122._12_4_;
      auVar153._0_4_ = fVar250 * auVar122._0_4_;
      auVar153._4_4_ = fVar211 * auVar122._4_4_;
      auVar153._8_4_ = fVar251 * auVar122._8_4_;
      auVar153._12_4_ = fVar212 * auVar122._12_4_;
      auVar156 = vminps_avx(auVar184,auVar286);
      auVar122 = vminps_avx(auVar118,auVar153);
      auVar269 = vminps_avx(auVar156,auVar122);
      auVar156 = vmaxps_avx(auVar286,auVar184);
      auVar122 = vmaxps_avx(auVar153,auVar118);
      auVar104 = vshufps_avx(auVar169,auVar169,0x54);
      auVar122 = vmaxps_avx(auVar122,auVar156);
      auVar105 = vshufps_avx(auVar304,auVar304,0);
      auVar136 = vshufps_avx(auVar304,auVar304,0x55);
      auVar156 = vhaddps_avx(auVar269,auVar269);
      auVar122 = vhaddps_avx(auVar122,auVar122);
      auVar170._0_4_ = auVar105._0_4_ * auVar82._0_4_ + auVar136._0_4_ * auVar221._0_4_;
      auVar170._4_4_ = auVar105._4_4_ * auVar82._4_4_ + auVar136._4_4_ * auVar221._4_4_;
      auVar170._8_4_ = auVar105._8_4_ * auVar82._8_4_ + auVar136._8_4_ * auVar221._8_4_;
      auVar170._12_4_ = auVar105._12_4_ * auVar82._12_4_ + auVar136._12_4_ * auVar221._12_4_;
      auVar269 = vsubps_avx(auVar104,auVar170);
      fVar249 = auVar269._0_4_ + auVar156._0_4_;
      fVar215 = auVar269._0_4_ + auVar122._0_4_;
      auVar156 = vmaxss_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar249));
      auVar122 = vminss_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar193));
    } while (auVar122._0_4_ < auVar156._0_4_);
    auVar156 = vmovshdup_avx(auVar82);
    auVar88._0_4_ = auVar156._0_4_ * auVar110._0_4_;
    auVar88._4_4_ = auVar156._4_4_ * auVar110._4_4_;
    auVar88._8_4_ = auVar156._8_4_ * auVar110._8_4_;
    auVar88._12_4_ = auVar156._12_4_ * auVar110._12_4_;
    auVar119._0_4_ = auVar142._0_4_ * auVar156._0_4_;
    auVar119._4_4_ = auVar142._4_4_ * auVar156._4_4_;
    auVar119._8_4_ = auVar142._8_4_ * auVar156._8_4_;
    auVar119._12_4_ = auVar142._12_4_ * auVar156._12_4_;
    auVar122 = vminps_avx(auVar88,auVar119);
    auVar156 = vmaxps_avx(auVar119,auVar88);
    auVar110 = vmovshdup_avx(auVar221);
    auVar185._0_4_ = auVar111._0_4_ * auVar110._0_4_;
    auVar185._4_4_ = auVar111._4_4_ * auVar110._4_4_;
    auVar185._8_4_ = auVar111._8_4_ * auVar110._8_4_;
    auVar185._12_4_ = auVar111._12_4_ * auVar110._12_4_;
    auVar120._0_4_ = auVar232._0_4_ * auVar110._0_4_;
    auVar120._4_4_ = auVar232._4_4_ * auVar110._4_4_;
    auVar120._8_4_ = auVar232._8_4_ * auVar110._8_4_;
    auVar120._12_4_ = auVar232._12_4_ * auVar110._12_4_;
    auVar110 = vminps_avx(auVar185,auVar120);
    auVar154._0_4_ = auVar122._0_4_ + auVar110._0_4_;
    auVar154._4_4_ = auVar122._4_4_ + auVar110._4_4_;
    auVar154._8_4_ = auVar122._8_4_ + auVar110._8_4_;
    auVar154._12_4_ = auVar122._12_4_ + auVar110._12_4_;
    auVar122 = vmaxps_avx(auVar120,auVar185);
    auVar89._0_4_ = auVar156._0_4_ + auVar122._0_4_;
    auVar89._4_4_ = auVar156._4_4_ + auVar122._4_4_;
    auVar89._8_4_ = auVar156._8_4_ + auVar122._8_4_;
    auVar89._12_4_ = auVar156._12_4_ + auVar122._12_4_;
    auVar156 = vsubps_avx(auVar225,auVar89);
    auVar122 = vsubps_avx(auVar225,auVar154);
    auVar155._0_4_ = fVar252 * auVar156._0_4_;
    auVar155._4_4_ = fVar213 * auVar156._4_4_;
    auVar155._8_4_ = fVar229 * auVar156._8_4_;
    auVar155._12_4_ = fVar230 * auVar156._12_4_;
    auVar186._0_4_ = fVar252 * auVar122._0_4_;
    auVar186._4_4_ = fVar213 * auVar122._4_4_;
    auVar186._8_4_ = fVar229 * auVar122._8_4_;
    auVar186._12_4_ = fVar230 * auVar122._12_4_;
    auVar90._0_4_ = fVar250 * auVar156._0_4_;
    auVar90._4_4_ = fVar211 * auVar156._4_4_;
    auVar90._8_4_ = fVar251 * auVar156._8_4_;
    auVar90._12_4_ = fVar212 * auVar156._12_4_;
    auVar121._0_4_ = fVar250 * auVar122._0_4_;
    auVar121._4_4_ = fVar211 * auVar122._4_4_;
    auVar121._8_4_ = fVar251 * auVar122._8_4_;
    auVar121._12_4_ = fVar212 * auVar122._12_4_;
    auVar156 = vminps_avx(auVar155,auVar186);
    auVar122 = vminps_avx(auVar90,auVar121);
    auVar156 = vminps_avx(auVar156,auVar122);
    auVar122 = vmaxps_avx(auVar186,auVar155);
    auVar110 = vmaxps_avx(auVar121,auVar90);
    auVar156 = vhaddps_avx(auVar156,auVar156);
    auVar122 = vmaxps_avx(auVar110,auVar122);
    auVar122 = vhaddps_avx(auVar122,auVar122);
    auVar110 = vmovshdup_avx(auVar269);
    auVar142 = ZEXT416((uint)(auVar110._0_4_ + auVar156._0_4_));
    auVar156 = vmaxss_avx(auVar335,auVar142);
    auVar110 = ZEXT416((uint)(auVar110._0_4_ + auVar122._0_4_));
    auVar122 = vminss_avx(auVar110,auVar77);
  } while (auVar122._0_4_ < auVar156._0_4_);
  uVar67 = 0;
  if ((fVar210 < fVar249) && (fVar215 < fVar193)) {
    auVar156 = vcmpps_avx(auVar110,auVar77,1);
    auVar122 = vcmpps_avx(auVar335,auVar142,1);
    auVar156 = vandps_avx(auVar122,auVar156);
    uVar67 = auVar156._0_4_;
  }
  auVar261._8_4_ = 0x7fffffff;
  auVar261._0_8_ = 0x7fffffff7fffffff;
  auVar261._12_4_ = 0x7fffffff;
  if (((uint)uVar73 < 4 && 0.001 <= fVar248) && (uVar67 & 1) == 0) goto LAB_0099ffe0;
  lVar70 = 0xc9;
  do {
    lVar70 = lVar70 + -1;
    if (lVar70 == 0) goto LAB_0099effb;
    fVar248 = auVar269._0_4_;
    fVar193 = 1.0 - fVar248;
    auVar156 = ZEXT416((uint)(fVar193 * fVar193 * fVar193));
    auVar156 = vshufps_avx(auVar156,auVar156,0);
    auVar122 = ZEXT416((uint)(fVar248 * 3.0 * fVar193 * fVar193));
    auVar122 = vshufps_avx(auVar122,auVar122,0);
    auVar110 = ZEXT416((uint)(fVar193 * fVar248 * fVar248 * 3.0));
    auVar110 = vshufps_avx(auVar110,auVar110,0);
    auVar142 = ZEXT416((uint)(fVar248 * fVar248 * fVar248));
    auVar142 = vshufps_avx(auVar142,auVar142,0);
    fVar193 = (float)local_6d0._0_4_ * auVar156._0_4_ +
              local_5b0 * auVar122._0_4_ +
              (float)local_3a0._0_4_ * auVar142._0_4_ + local_5c0 * auVar110._0_4_;
    fVar248 = (float)local_6d0._4_4_ * auVar156._4_4_ +
              fStack_5ac * auVar122._4_4_ +
              (float)local_3a0._4_4_ * auVar142._4_4_ + fStack_5bc * auVar110._4_4_;
    auVar91._0_8_ = CONCAT44(fVar248,fVar193);
    auVar91._8_4_ =
         fStack_6c8 * auVar156._8_4_ +
         fStack_5a8 * auVar122._8_4_ + fStack_398 * auVar142._8_4_ + fStack_5b8 * auVar110._8_4_;
    auVar91._12_4_ =
         fStack_6c4 * auVar156._12_4_ +
         fStack_5a4 * auVar122._12_4_ + fStack_394 * auVar142._12_4_ + fStack_5b4 * auVar110._12_4_;
    auVar123._8_8_ = auVar91._0_8_;
    auVar123._0_8_ = auVar91._0_8_;
    auVar122 = vshufpd_avx(auVar91,auVar91,1);
    auVar156 = vmovshdup_avx(auVar269);
    auVar122 = vsubps_avx(auVar122,auVar123);
    auVar92._0_4_ = auVar156._0_4_ * auVar122._0_4_ + fVar193;
    auVar92._4_4_ = auVar156._4_4_ * auVar122._4_4_ + fVar248;
    auVar92._8_4_ = auVar156._8_4_ * auVar122._8_4_ + fVar193;
    auVar92._12_4_ = auVar156._12_4_ * auVar122._12_4_ + fVar248;
    auVar156 = vshufps_avx(auVar92,auVar92,0);
    auVar122 = vshufps_avx(auVar92,auVar92,0x55);
    auVar124._0_4_ = auVar82._0_4_ * auVar156._0_4_ + auVar221._0_4_ * auVar122._0_4_;
    auVar124._4_4_ = auVar82._4_4_ * auVar156._4_4_ + auVar221._4_4_ * auVar122._4_4_;
    auVar124._8_4_ = auVar82._8_4_ * auVar156._8_4_ + auVar221._8_4_ * auVar122._8_4_;
    auVar124._12_4_ = auVar82._12_4_ * auVar156._12_4_ + auVar221._12_4_ * auVar122._12_4_;
    auVar269 = vsubps_avx(auVar269,auVar124);
    auVar156 = vandps_avx(auVar261,auVar92);
    auVar122 = vshufps_avx(auVar156,auVar156,0xf5);
    auVar156 = vmaxss_avx(auVar122,auVar156);
  } while ((float)local_3b0._0_4_ <= auVar156._0_4_);
  fVar193 = auVar269._0_4_;
  if ((fVar193 < 0.0) || (1.0 < fVar193)) goto LAB_0099effb;
  auVar82 = vmovshdup_avx(auVar269);
  fVar248 = auVar82._0_4_;
  if ((fVar248 < 0.0) || (1.0 < fVar248)) goto LAB_0099effb;
  auVar82 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar232 = vinsertps_avx(auVar82,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar82 = vdpps_avx(auVar232,local_3c0,0x7f);
  auVar221 = vdpps_avx(auVar232,local_3d0,0x7f);
  auVar156 = vdpps_avx(auVar232,local_400,0x7f);
  auVar122 = vdpps_avx(auVar232,local_410,0x7f);
  auVar110 = vdpps_avx(auVar232,local_420,0x7f);
  auVar142 = vdpps_avx(auVar232,local_430,0x7f);
  fVar211 = 1.0 - fVar248;
  auVar111 = vdpps_avx(auVar232,local_3e0,0x7f);
  auVar232 = vdpps_avx(auVar232,local_3f0,0x7f);
  fVar251 = 1.0 - fVar193;
  fVar210 = auVar269._4_4_;
  fVar249 = auVar269._8_4_;
  fVar215 = auVar269._12_4_;
  fVar250 = fVar251 * fVar193 * fVar193 * 3.0;
  auVar205._0_4_ = fVar193 * fVar193 * fVar193;
  auVar205._4_4_ = fVar210 * fVar210 * fVar210;
  auVar205._8_4_ = fVar249 * fVar249 * fVar249;
  auVar205._12_4_ = fVar215 * fVar215 * fVar215;
  fVar210 = fVar193 * 3.0 * fVar251 * fVar251;
  fVar249 = fVar251 * fVar251 * fVar251;
  fVar193 = (fVar211 * auVar82._0_4_ + fVar248 * auVar156._0_4_) * fVar249 +
            (fVar211 * auVar221._0_4_ + fVar248 * auVar122._0_4_) * fVar210 +
            fVar250 * (fVar211 * auVar111._0_4_ + fVar248 * auVar110._0_4_) +
            auVar205._0_4_ * (auVar142._0_4_ * fVar248 + fVar211 * auVar232._0_4_);
  if ((fVar193 < fVar235) || (fVar248 = *(float *)(ray + k * 4 + 0x100), fVar248 < fVar193))
  goto LAB_0099effb;
  pGVar11 = (context->scene->geometries).items[uVar68].ptr;
  if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar65 = 1, pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0099ffc1;
    local_f0 = vshufps_avx(auVar269,auVar269,0x55);
    auVar262._8_4_ = 0x3f800000;
    auVar262._0_8_ = 0x3f8000003f800000;
    auVar262._12_4_ = 0x3f800000;
    auVar82 = vsubps_avx(auVar262,local_f0);
    fVar215 = local_f0._0_4_;
    fVar211 = local_f0._4_4_;
    fVar212 = local_f0._8_4_;
    fVar252 = local_f0._12_4_;
    fVar213 = auVar82._0_4_;
    fVar229 = auVar82._4_4_;
    fVar230 = auVar82._8_4_;
    fVar231 = auVar82._12_4_;
    auVar273._0_4_ = fVar215 * (float)local_4f0._0_4_ + fVar213 * (float)local_4e0._0_4_;
    auVar273._4_4_ = fVar211 * (float)local_4f0._4_4_ + fVar229 * (float)local_4e0._4_4_;
    auVar273._8_4_ = fVar212 * fStack_4e8 + fVar230 * fStack_4d8;
    auVar273._12_4_ = fVar252 * fStack_4e4 + fVar231 * fStack_4d4;
    auVar287._0_4_ = fVar215 * (float)local_540._0_4_ + fVar213 * (float)local_520._0_4_;
    auVar287._4_4_ = fVar211 * (float)local_540._4_4_ + fVar229 * (float)local_520._4_4_;
    auVar287._8_4_ = fVar212 * fStack_538 + fVar230 * fStack_518;
    auVar287._12_4_ = fVar252 * fStack_534 + fVar231 * fStack_514;
    auVar296._0_4_ = fVar215 * (float)local_450._0_4_ + fVar213 * (float)local_530._0_4_;
    auVar296._4_4_ = fVar211 * (float)local_450._4_4_ + fVar229 * (float)local_530._4_4_;
    auVar296._8_4_ = fVar212 * fStack_448 + fVar230 * fStack_528;
    auVar296._12_4_ = fVar252 * fStack_444 + fVar231 * fStack_524;
    auVar263._0_4_ = fVar215 * (float)local_510._0_4_ + fVar213 * (float)local_500._0_4_;
    auVar263._4_4_ = fVar211 * (float)local_510._4_4_ + fVar229 * (float)local_500._4_4_;
    auVar263._8_4_ = fVar212 * fStack_508 + fVar230 * fStack_4f8;
    auVar263._12_4_ = fVar252 * fStack_504 + fVar231 * fStack_4f4;
    auVar122 = vsubps_avx(auVar287,auVar273);
    auVar110 = vsubps_avx(auVar296,auVar287);
    auVar142 = vsubps_avx(auVar263,auVar296);
    local_110 = vshufps_avx(auVar269,auVar269,0);
    fVar215 = local_110._0_4_;
    fVar212 = local_110._4_4_;
    fVar252 = local_110._8_4_;
    fVar229 = local_110._12_4_;
    auVar82 = vshufps_avx(ZEXT416((uint)fVar251),ZEXT416((uint)fVar251),0);
    fVar211 = auVar82._0_4_;
    fVar251 = auVar82._4_4_;
    fVar213 = auVar82._8_4_;
    fVar230 = auVar82._12_4_;
    auVar82 = vshufps_avx(auVar205,auVar205,0);
    auVar221 = vshufps_avx(ZEXT416((uint)fVar250),ZEXT416((uint)fVar250),0);
    auVar156 = vshufps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),0);
    auVar187._0_4_ =
         ((auVar110._0_4_ * fVar211 + auVar142._0_4_ * fVar215) * fVar215 +
         (auVar122._0_4_ * fVar211 + auVar110._0_4_ * fVar215) * fVar211) * 3.0;
    auVar187._4_4_ =
         ((auVar110._4_4_ * fVar251 + auVar142._4_4_ * fVar212) * fVar212 +
         (auVar122._4_4_ * fVar251 + auVar110._4_4_ * fVar212) * fVar251) * 3.0;
    auVar187._8_4_ =
         ((auVar110._8_4_ * fVar213 + auVar142._8_4_ * fVar252) * fVar252 +
         (auVar122._8_4_ * fVar213 + auVar110._8_4_ * fVar252) * fVar213) * 3.0;
    auVar187._12_4_ =
         ((auVar110._12_4_ * fVar230 + auVar142._12_4_ * fVar229) * fVar229 +
         (auVar122._12_4_ * fVar230 + auVar110._12_4_ * fVar229) * fVar230) * 3.0;
    auVar122 = vshufps_avx(ZEXT416((uint)fVar249),ZEXT416((uint)fVar249),0);
    auVar125._0_4_ =
         auVar122._0_4_ * (float)local_460._0_4_ +
         auVar156._0_4_ * (float)local_470._0_4_ +
         auVar82._0_4_ * (float)local_490._0_4_ + auVar221._0_4_ * (float)local_480._0_4_;
    auVar125._4_4_ =
         auVar122._4_4_ * (float)local_460._4_4_ +
         auVar156._4_4_ * (float)local_470._4_4_ +
         auVar82._4_4_ * (float)local_490._4_4_ + auVar221._4_4_ * (float)local_480._4_4_;
    auVar125._8_4_ =
         auVar122._8_4_ * fStack_458 +
         auVar156._8_4_ * fStack_468 + auVar82._8_4_ * fStack_488 + auVar221._8_4_ * fStack_478;
    auVar125._12_4_ =
         auVar122._12_4_ * fStack_454 +
         auVar156._12_4_ * fStack_464 + auVar82._12_4_ * fStack_484 + auVar221._12_4_ * fStack_474;
    auVar82 = vshufps_avx(auVar187,auVar187,0xc9);
    auVar157._0_4_ = auVar125._0_4_ * auVar82._0_4_;
    auVar157._4_4_ = auVar125._4_4_ * auVar82._4_4_;
    auVar157._8_4_ = auVar125._8_4_ * auVar82._8_4_;
    auVar157._12_4_ = auVar125._12_4_ * auVar82._12_4_;
    auVar82 = vshufps_avx(auVar125,auVar125,0xc9);
    auVar126._0_4_ = auVar187._0_4_ * auVar82._0_4_;
    auVar126._4_4_ = auVar187._4_4_ * auVar82._4_4_;
    auVar126._8_4_ = auVar187._8_4_ * auVar82._8_4_;
    auVar126._12_4_ = auVar187._12_4_ * auVar82._12_4_;
    auVar82 = vsubps_avx(auVar126,auVar157);
    local_170 = vshufps_avx(auVar82,auVar82,0x55);
    local_180[0] = (RTCHitN)local_170[0];
    local_180[1] = (RTCHitN)local_170[1];
    local_180[2] = (RTCHitN)local_170[2];
    local_180[3] = (RTCHitN)local_170[3];
    local_180[4] = (RTCHitN)local_170[4];
    local_180[5] = (RTCHitN)local_170[5];
    local_180[6] = (RTCHitN)local_170[6];
    local_180[7] = (RTCHitN)local_170[7];
    local_180[8] = (RTCHitN)local_170[8];
    local_180[9] = (RTCHitN)local_170[9];
    local_180[10] = (RTCHitN)local_170[10];
    local_180[0xb] = (RTCHitN)local_170[0xb];
    local_180[0xc] = (RTCHitN)local_170[0xc];
    local_180[0xd] = (RTCHitN)local_170[0xd];
    local_180[0xe] = (RTCHitN)local_170[0xe];
    local_180[0xf] = (RTCHitN)local_170[0xf];
    local_150 = vshufps_avx(auVar82,auVar82,0xaa);
    local_160 = local_150;
    local_130 = vshufps_avx(auVar82,auVar82,0);
    local_140 = local_130;
    local_120 = local_110;
    local_100 = local_f0;
    local_e0 = local_340._0_8_;
    uStack_d8 = local_340._8_8_;
    uStack_d0 = local_340._16_8_;
    uStack_c8 = local_340._24_8_;
    local_c0 = local_320;
    vcmpps_avx(local_320,local_320,0xf);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar193;
    local_580 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar66 & 0xf) << 4));
    local_570 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar66 >> 4) * 0x10);
    local_4c0.valid = (int *)local_580;
    local_4c0.geometryUserPtr = pGVar11->userPtr;
    local_4c0.context = context->user;
    local_4c0.ray = (RTCRayN *)ray;
    local_4c0.hit = local_180;
    local_4c0.N = 8;
    if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar11->occlusionFilterN)(&local_4c0);
    }
    auVar82 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
    auVar221 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
    auVar163._16_16_ = auVar221;
    auVar163._0_16_ = auVar82;
    auVar93 = _DAT_01f7b020 & ~auVar163;
    if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar93 >> 0x7f,0) != '\0') ||
          (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar93 >> 0xbf,0) != '\0') ||
        (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar93[0x1f] < '\0')
    {
      p_Var12 = context->args->filter;
      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var12)(&local_4c0);
      }
      auVar82 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
      auVar221 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
      auVar102._16_16_ = auVar221;
      auVar102._0_16_ = auVar82;
      auVar135._8_4_ = 0xff800000;
      auVar135._0_8_ = 0xff800000ff800000;
      auVar135._12_4_ = 0xff800000;
      auVar135._16_4_ = 0xff800000;
      auVar135._20_4_ = 0xff800000;
      auVar135._24_4_ = 0xff800000;
      auVar135._28_4_ = 0xff800000;
      auVar93 = vblendvps_avx(auVar135,*(undefined1 (*) [32])(local_4c0.ray + 0x100),auVar102);
      *(undefined1 (*) [32])(local_4c0.ray + 0x100) = auVar93;
      auVar93 = _DAT_01f7b020 & ~auVar102;
      if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar93 >> 0x7f,0) != '\0') ||
            (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar93 >> 0xbf,0) != '\0') ||
          (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar93[0x1f] < '\0') {
        bVar65 = 1;
        goto LAB_0099ffc1;
      }
    }
    *(float *)(ray + k * 4 + 0x100) = fVar248;
  }
  bVar65 = 0;
LAB_0099ffc1:
  bVar75 = (bool)(bVar75 | bVar65);
  goto LAB_0099effb;
LAB_0099ffe0:
  auVar82 = vinsertps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar193),0x10);
  auVar337 = ZEXT1664(auVar82);
  auVar329 = ZEXT1664(auVar335);
  goto LAB_0099e98c;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }